

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

void shallue_van_de_woestijne(secp256k1_ge *ge,secp256k1_fe *t)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  undefined1 auVar611 [16];
  undefined1 auVar612 [16];
  undefined1 auVar613 [16];
  undefined1 auVar614 [16];
  undefined1 auVar615 [16];
  undefined1 auVar616 [16];
  undefined1 auVar617 [16];
  undefined1 auVar618 [16];
  undefined1 auVar619 [16];
  undefined1 auVar620 [16];
  undefined1 auVar621 [16];
  undefined1 auVar622 [16];
  undefined1 auVar623 [16];
  undefined1 auVar624 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar631 [16];
  undefined1 auVar632 [16];
  undefined1 auVar633 [16];
  undefined1 auVar634 [16];
  undefined1 auVar635 [16];
  undefined1 auVar636 [16];
  undefined1 auVar637 [16];
  undefined1 auVar638 [16];
  undefined1 auVar639 [16];
  undefined1 auVar640 [16];
  undefined1 auVar641 [16];
  undefined1 auVar642 [16];
  undefined1 auVar643 [16];
  undefined1 auVar644 [16];
  undefined1 auVar645 [16];
  undefined1 auVar646 [16];
  undefined1 auVar647 [16];
  undefined1 auVar648 [16];
  undefined1 auVar649 [16];
  undefined1 auVar650 [16];
  undefined1 auVar651 [16];
  undefined1 auVar652 [16];
  undefined1 auVar653 [16];
  undefined1 auVar654 [16];
  undefined1 auVar655 [16];
  undefined1 auVar656 [16];
  undefined1 auVar657 [16];
  undefined1 auVar658 [16];
  undefined1 auVar659 [16];
  undefined1 auVar660 [16];
  undefined1 auVar661 [16];
  undefined1 auVar662 [16];
  undefined1 auVar663 [16];
  undefined1 auVar664 [16];
  undefined1 auVar665 [16];
  undefined1 auVar666 [16];
  undefined1 auVar667 [16];
  undefined1 auVar668 [16];
  undefined1 auVar669 [16];
  undefined1 auVar670 [16];
  undefined1 auVar671 [16];
  undefined1 auVar672 [16];
  undefined1 auVar673 [16];
  undefined1 auVar674 [16];
  undefined1 auVar675 [16];
  undefined1 auVar676 [16];
  undefined1 auVar677 [16];
  undefined1 auVar678 [16];
  undefined1 auVar679 [16];
  undefined1 auVar680 [16];
  undefined1 auVar681 [16];
  undefined1 auVar682 [16];
  undefined1 auVar683 [16];
  undefined1 auVar684 [16];
  undefined1 auVar685 [16];
  undefined1 auVar686 [16];
  undefined1 auVar687 [16];
  undefined1 auVar688 [16];
  undefined1 auVar689 [16];
  undefined1 auVar690 [16];
  undefined1 auVar691 [16];
  undefined1 auVar692 [16];
  undefined1 auVar693 [16];
  undefined1 auVar694 [16];
  undefined1 auVar695 [16];
  undefined1 auVar696 [16];
  undefined1 auVar697 [16];
  undefined1 auVar698 [16];
  undefined1 auVar699 [16];
  undefined1 auVar700 [16];
  undefined1 auVar701 [16];
  undefined1 auVar702 [16];
  undefined1 auVar703 [16];
  undefined1 auVar704 [16];
  undefined1 auVar705 [16];
  undefined1 auVar706 [16];
  undefined1 auVar707 [16];
  undefined1 auVar708 [16];
  undefined1 auVar709 [16];
  undefined1 auVar710 [16];
  undefined1 auVar711 [16];
  undefined1 auVar712 [16];
  undefined1 auVar713 [16];
  undefined1 auVar714 [16];
  undefined1 auVar715 [16];
  undefined1 auVar716 [16];
  undefined1 auVar717 [16];
  undefined1 auVar718 [16];
  undefined1 auVar719 [16];
  undefined1 auVar720 [16];
  undefined1 auVar721 [16];
  undefined1 auVar722 [16];
  undefined1 auVar723 [16];
  undefined1 auVar724 [16];
  undefined1 auVar725 [16];
  undefined1 auVar726 [16];
  undefined1 auVar727 [16];
  undefined1 auVar728 [16];
  undefined1 auVar729 [16];
  undefined1 auVar730 [16];
  undefined1 auVar731 [16];
  undefined1 auVar732 [16];
  undefined1 auVar733 [16];
  undefined1 auVar734 [16];
  undefined1 auVar735 [16];
  undefined1 auVar736 [16];
  undefined1 auVar737 [16];
  undefined1 auVar738 [16];
  undefined1 auVar739 [16];
  undefined1 auVar740 [16];
  undefined1 auVar741 [16];
  undefined1 auVar742 [16];
  undefined1 auVar743 [16];
  undefined1 auVar744 [16];
  undefined1 auVar745 [16];
  undefined1 auVar746 [16];
  undefined1 auVar747 [16];
  undefined1 auVar748 [16];
  undefined1 auVar749 [16];
  undefined1 auVar750 [16];
  undefined1 auVar751 [16];
  undefined1 auVar752 [16];
  undefined1 auVar753 [16];
  undefined1 auVar754 [16];
  undefined1 auVar755 [16];
  undefined1 auVar756 [16];
  undefined1 auVar757 [16];
  undefined1 auVar758 [16];
  undefined1 auVar759 [16];
  undefined1 auVar760 [16];
  undefined1 auVar761 [16];
  undefined1 auVar762 [16];
  undefined1 auVar763 [16];
  undefined1 auVar764 [16];
  undefined1 auVar765 [16];
  undefined1 auVar766 [16];
  undefined1 auVar767 [16];
  undefined1 auVar768 [16];
  undefined1 auVar769 [16];
  undefined1 auVar770 [16];
  undefined1 auVar771 [16];
  undefined1 auVar772 [16];
  undefined1 auVar773 [16];
  undefined1 auVar774 [16];
  undefined1 auVar775 [16];
  undefined1 auVar776 [16];
  undefined1 auVar777 [16];
  undefined1 auVar778 [16];
  undefined1 auVar779 [16];
  undefined1 auVar780 [16];
  undefined1 auVar781 [16];
  undefined1 auVar782 [16];
  undefined1 auVar783 [16];
  undefined1 auVar784 [16];
  undefined1 auVar785 [16];
  undefined1 auVar786 [16];
  undefined1 auVar787 [16];
  undefined1 auVar788 [16];
  undefined1 auVar789 [16];
  undefined1 auVar790 [16];
  undefined1 auVar791 [16];
  undefined1 auVar792 [16];
  undefined1 auVar793 [16];
  undefined1 auVar794 [16];
  undefined1 auVar795 [16];
  undefined1 auVar796 [16];
  undefined1 auVar797 [16];
  undefined1 auVar798 [16];
  undefined1 auVar799 [16];
  undefined1 auVar800 [16];
  undefined1 auVar801 [16];
  undefined1 auVar802 [16];
  undefined1 auVar803 [16];
  undefined1 auVar804 [16];
  undefined1 auVar805 [16];
  undefined1 auVar806 [16];
  undefined1 auVar807 [16];
  undefined1 auVar808 [16];
  undefined1 auVar809 [16];
  undefined1 auVar810 [16];
  undefined1 auVar811 [16];
  undefined1 auVar812 [16];
  undefined1 auVar813 [16];
  undefined1 auVar814 [16];
  undefined1 auVar815 [16];
  undefined1 auVar816 [16];
  undefined1 auVar817 [16];
  undefined1 auVar818 [16];
  undefined1 auVar819 [16];
  undefined1 auVar820 [16];
  undefined1 auVar821 [16];
  undefined1 auVar822 [16];
  undefined1 auVar823 [16];
  undefined1 auVar824 [16];
  undefined1 auVar825 [16];
  undefined1 auVar826 [16];
  undefined1 auVar827 [16];
  undefined1 auVar828 [16];
  undefined1 auVar829 [16];
  undefined1 auVar830 [16];
  undefined1 auVar831 [16];
  undefined1 auVar832 [16];
  undefined1 auVar833 [16];
  undefined1 auVar834 [16];
  undefined1 auVar835 [16];
  undefined1 auVar836 [16];
  undefined1 auVar837 [16];
  undefined1 auVar838 [16];
  undefined1 auVar839 [16];
  undefined1 auVar840 [16];
  undefined1 auVar841 [16];
  undefined1 auVar842 [16];
  undefined1 auVar843 [16];
  undefined1 auVar844 [16];
  undefined1 auVar845 [16];
  undefined1 auVar846 [16];
  undefined1 auVar847 [16];
  undefined1 auVar848 [16];
  undefined1 auVar849 [16];
  undefined1 auVar850 [16];
  undefined1 auVar851 [16];
  undefined1 auVar852 [16];
  undefined1 auVar853 [16];
  undefined1 auVar854 [16];
  undefined1 auVar855 [16];
  undefined1 auVar856 [16];
  undefined1 auVar857 [16];
  undefined1 auVar858 [16];
  undefined1 auVar859 [16];
  undefined1 auVar860 [16];
  undefined1 auVar861 [16];
  undefined1 auVar862 [16];
  undefined1 auVar863 [16];
  undefined1 auVar864 [16];
  undefined1 auVar865 [16];
  undefined1 auVar866 [16];
  undefined1 auVar867 [16];
  undefined1 auVar868 [16];
  undefined1 auVar869 [16];
  undefined1 auVar870 [16];
  undefined1 auVar871 [16];
  undefined1 auVar872 [16];
  undefined1 auVar873 [16];
  undefined1 auVar874 [16];
  undefined1 auVar875 [16];
  undefined1 auVar876 [16];
  undefined1 auVar877 [16];
  undefined1 auVar878 [16];
  undefined1 auVar879 [16];
  undefined1 auVar880 [16];
  undefined1 auVar881 [16];
  undefined1 auVar882 [16];
  undefined1 auVar883 [16];
  undefined1 auVar884 [16];
  undefined1 auVar885 [16];
  undefined1 auVar886 [16];
  undefined1 auVar887 [16];
  undefined1 auVar888 [16];
  undefined1 auVar889 [16];
  undefined1 auVar890 [16];
  undefined1 auVar891 [16];
  undefined1 auVar892 [16];
  undefined1 auVar893 [16];
  undefined1 auVar894 [16];
  undefined1 auVar895 [16];
  undefined1 auVar896 [16];
  undefined1 auVar897 [16];
  undefined1 auVar898 [16];
  undefined1 auVar899 [16];
  undefined1 auVar900 [16];
  undefined1 auVar901 [16];
  undefined1 auVar902 [16];
  undefined1 auVar903 [16];
  undefined1 auVar904 [16];
  undefined1 auVar905 [16];
  undefined1 auVar906 [16];
  undefined1 auVar907 [16];
  undefined1 auVar908 [16];
  undefined1 auVar909 [16];
  undefined1 auVar910 [16];
  undefined1 auVar911 [16];
  undefined1 auVar912 [16];
  undefined1 auVar913 [16];
  undefined1 auVar914 [16];
  undefined1 auVar915 [16];
  undefined1 auVar916 [16];
  undefined1 auVar917 [16];
  undefined1 auVar918 [16];
  undefined1 auVar919 [16];
  undefined1 auVar920 [16];
  undefined1 auVar921 [16];
  undefined1 auVar922 [16];
  undefined1 auVar923 [16];
  undefined1 auVar924 [16];
  undefined1 auVar925 [16];
  undefined1 auVar926 [16];
  undefined1 auVar927 [16];
  undefined1 auVar928 [16];
  undefined1 auVar929 [16];
  undefined1 auVar930 [16];
  undefined1 auVar931 [16];
  undefined1 auVar932 [16];
  undefined1 auVar933 [16];
  undefined1 auVar934 [16];
  undefined1 auVar935 [16];
  undefined1 auVar936 [16];
  undefined1 auVar937 [16];
  undefined1 auVar938 [16];
  undefined1 auVar939 [16];
  undefined1 auVar940 [16];
  undefined1 auVar941 [16];
  undefined1 auVar942 [16];
  undefined1 auVar943 [16];
  undefined1 auVar944 [16];
  undefined1 auVar945 [16];
  undefined1 auVar946 [16];
  undefined1 auVar947 [16];
  undefined1 auVar948 [16];
  undefined1 auVar949 [16];
  undefined1 auVar950 [16];
  undefined1 auVar951 [16];
  undefined1 auVar952 [16];
  undefined1 auVar953 [16];
  undefined1 auVar954 [16];
  undefined1 auVar955 [16];
  undefined1 auVar956 [16];
  undefined1 auVar957 [16];
  undefined1 auVar958 [16];
  undefined1 auVar959 [16];
  undefined1 auVar960 [16];
  undefined1 auVar961 [16];
  undefined1 auVar962 [16];
  undefined1 auVar963 [16];
  undefined1 auVar964 [16];
  undefined1 auVar965 [16];
  undefined1 auVar966 [16];
  undefined1 auVar967 [16];
  undefined1 auVar968 [16];
  undefined1 auVar969 [16];
  undefined1 auVar970 [16];
  undefined1 auVar971 [16];
  undefined1 auVar972 [16];
  undefined1 auVar973 [16];
  undefined1 auVar974 [16];
  undefined1 auVar975 [16];
  undefined1 auVar976 [16];
  undefined1 auVar977 [16];
  undefined1 auVar978 [16];
  undefined1 auVar979 [16];
  undefined1 auVar980 [16];
  undefined1 auVar981 [16];
  undefined1 auVar982 [16];
  undefined1 auVar983 [16];
  undefined1 auVar984 [16];
  undefined1 auVar985 [16];
  undefined1 auVar986 [16];
  undefined1 auVar987 [16];
  undefined1 auVar988 [16];
  undefined1 auVar989 [16];
  undefined1 auVar990 [16];
  undefined1 auVar991 [16];
  undefined1 auVar992 [16];
  undefined1 auVar993 [16];
  undefined1 auVar994 [16];
  undefined1 auVar995 [16];
  undefined1 auVar996 [16];
  undefined1 auVar997 [16];
  undefined1 auVar998 [16];
  undefined1 auVar999 [16];
  undefined1 auVar1000 [16];
  undefined1 auVar1001 [16];
  undefined1 auVar1002 [16];
  undefined1 auVar1003 [16];
  undefined1 auVar1004 [16];
  undefined1 auVar1005 [16];
  undefined1 auVar1006 [16];
  undefined1 auVar1007 [16];
  undefined1 auVar1008 [16];
  undefined1 auVar1009 [16];
  undefined1 auVar1010 [16];
  undefined1 auVar1011 [16];
  undefined1 auVar1012 [16];
  undefined1 auVar1013 [16];
  undefined1 auVar1014 [16];
  undefined1 auVar1015 [16];
  undefined1 auVar1016 [16];
  undefined1 auVar1017 [16];
  undefined1 auVar1018 [16];
  undefined1 auVar1019 [16];
  undefined1 auVar1020 [16];
  undefined1 auVar1021 [16];
  undefined1 auVar1022 [16];
  undefined1 auVar1023 [16];
  undefined1 auVar1024 [16];
  undefined1 auVar1025 [16];
  undefined1 auVar1026 [16];
  undefined1 auVar1027 [16];
  undefined1 auVar1028 [16];
  undefined1 auVar1029 [16];
  undefined1 auVar1030 [16];
  undefined1 auVar1031 [16];
  undefined1 auVar1032 [16];
  undefined1 auVar1033 [16];
  undefined1 auVar1034 [16];
  undefined1 auVar1035 [16];
  undefined1 auVar1036 [16];
  undefined1 auVar1037 [16];
  undefined1 auVar1038 [16];
  undefined1 auVar1039 [16];
  undefined1 auVar1040 [16];
  undefined1 auVar1041 [16];
  undefined1 auVar1042 [16];
  undefined1 auVar1043 [16];
  undefined1 auVar1044 [16];
  undefined1 auVar1045 [16];
  undefined1 auVar1046 [16];
  undefined1 auVar1047 [16];
  undefined1 auVar1048 [16];
  undefined1 auVar1049 [16];
  undefined1 auVar1050 [16];
  undefined1 auVar1051 [16];
  undefined1 auVar1052 [16];
  undefined1 auVar1053 [16];
  undefined1 auVar1054 [16];
  undefined1 auVar1055 [16];
  undefined1 auVar1056 [16];
  undefined1 auVar1057 [16];
  undefined1 auVar1058 [16];
  undefined1 auVar1059 [16];
  undefined1 auVar1060 [16];
  undefined1 auVar1061 [16];
  undefined1 auVar1062 [16];
  undefined1 auVar1063 [16];
  undefined1 auVar1064 [16];
  undefined1 auVar1065 [16];
  undefined1 auVar1066 [16];
  undefined1 auVar1067 [16];
  uint uVar1068;
  uint uVar1069;
  ulong uVar1070;
  ulong uVar1071;
  ulong uVar1072;
  ulong uVar1073;
  ulong uVar1074;
  ulong uVar1075;
  ulong uVar1076;
  ulong uVar1077;
  ulong uVar1078;
  ulong uVar1079;
  ulong uVar1080;
  ulong uVar1081;
  ulong uVar1082;
  ulong uVar1083;
  ulong uVar1084;
  undefined1 auVar1085 [16];
  undefined1 auVar1086 [16];
  undefined1 auVar1087 [16];
  undefined1 auVar1088 [16];
  undefined1 auVar1089 [16];
  undefined1 auVar1090 [16];
  undefined1 auVar1091 [16];
  undefined1 auVar1092 [16];
  undefined1 auVar1093 [16];
  undefined1 auVar1094 [16];
  undefined1 auVar1095 [16];
  undefined1 auVar1096 [16];
  secp256k1_fe x3;
  uint64_t tmp3_7;
  uint64_t tmp3_6;
  uint64_t tmp3_10;
  secp256k1_fe x2;
  uint64_t tmp3_3;
  uint64_t tmp3_1;
  uint64_t tmp1;
  uint64_t tmp3_9;
  uint64_t tmp3;
  secp256k1_fe jinv;
  secp256k1_fe y2;
  uint64_t tmp2;
  secp256k1_fe y3;
  secp256k1_fe x3d;
  secp256k1_fe wn;
  secp256k1_fe local_2e8;
  secp256k1_fe local_2c0;
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  ulong local_278;
  ulong local_268;
  ulong uStack_260;
  ulong local_258;
  ulong uStack_250;
  ulong local_248;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  ulong local_218;
  ulong local_208;
  ulong uStack_200;
  ulong local_1f8;
  ulong uStack_1f0;
  ulong local_1e8;
  ulong local_1d8;
  ulong uStack_1d0;
  ulong local_1c8;
  ulong uStack_1c0;
  ulong local_1b8;
  secp256k1_fe local_1b0;
  ulong local_188;
  ulong uStack_180;
  ulong local_178;
  ulong uStack_170;
  ulong local_168;
  secp256k1_fe local_160;
  undefined1 local_138 [32];
  ulong local_118;
  ulong local_108;
  ulong uStack_100;
  ulong local_f8;
  ulong uStack_f0;
  ulong local_e8;
  undefined1 local_d8 [32];
  ulong local_b8;
  ulong local_a8;
  ulong uStack_a0;
  ulong local_98;
  ulong uStack_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  long lStack_50;
  long local_48;
  long lStack_40;
  long local_38;
  
  local_298._8_8_ = local_298._0_8_;
  auVar1089._8_8_ = 0;
  auVar1089._0_8_ = t->n[0];
  auVar1094._8_8_ = 0;
  auVar1094._0_8_ = t->n[1];
  auVar1095._8_8_ = 0;
  auVar1095._0_8_ = t->n[2];
  auVar1096._8_8_ = 0;
  auVar1096._0_8_ = t->n[3];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = t->n[4];
  uVar1070 = SUB168(auVar1 * ZEXT816(0xa2d2ba93507),0);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar1070 & 0xfffffffffffff;
  auVar1089 = auVar1094 * ZEXT816(0x797962cc61f6d) + auVar1089 * ZEXT816(0xf1df233770c2a) +
              auVar1095 * ZEXT816(0x15da14ecd47d8) + auVar1096 * ZEXT816(0xd27ae1cd5f852) +
              auVar2 * ZEXT816(0x1000003d10);
  uVar1072 = auVar1089._0_8_;
  auVar922._8_8_ = 0;
  auVar922._0_8_ = uVar1072 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = t->n[0];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = t->n[1];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = t->n[2];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = t->n[3];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = t->n[4];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar1070 >> 0x34 | SUB168(auVar1 * ZEXT816(0xa2d2ba93507),8) << 0xc;
  auVar1089 = auVar3 * ZEXT816(0xa2d2ba93507) + auVar922 + auVar4 * ZEXT816(0xf1df233770c2a) +
              auVar5 * ZEXT816(0x797962cc61f6d) + auVar6 * ZEXT816(0x15da14ecd47d8) +
              auVar7 * ZEXT816(0xd27ae1cd5f852) + auVar8 * ZEXT816(0x1000003d10);
  uVar1070 = auVar1089._0_8_;
  auVar923._8_8_ = 0;
  auVar923._0_8_ = uVar1070 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = t->n[0];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = t->n[1];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = t->n[2];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = t->n[3];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = t->n[4];
  auVar1089 = auVar10 * ZEXT816(0xa2d2ba93507) + auVar923 + auVar11 * ZEXT816(0xf1df233770c2a) +
              auVar12 * ZEXT816(0x797962cc61f6d) + auVar13 * ZEXT816(0x15da14ecd47d8);
  uVar1073 = auVar1089._0_8_;
  auVar925._8_8_ = 0;
  auVar925._0_8_ = uVar1073 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar537._8_8_ = 0;
  auVar537._0_8_ = (uVar1073 & 0xfffffffffffff) << 4 | (uVar1070 & 0xfffffffffffff) >> 0x30;
  auVar1089 = auVar9 * ZEXT816(0xd27ae1cd5f852) + ZEXT816(0x1000003d1) * auVar537;
  uVar1073 = auVar1089._0_8_;
  local_80 = uVar1073 & 0xfffffffffffff;
  auVar924._8_8_ = 0;
  auVar924._0_8_ = uVar1073 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = t->n[0];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = t->n[1];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = t->n[2];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = t->n[3];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = t->n[4];
  auVar1094 = auVar16 * ZEXT816(0xa2d2ba93507) + auVar925 + auVar17 * ZEXT816(0xf1df233770c2a) +
              auVar18 * ZEXT816(0x797962cc61f6d);
  uVar1073 = auVar1094._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar1073 & 0xfffffffffffff;
  auVar1089 = auVar14 * ZEXT816(0x15da14ecd47d8) + auVar924 + auVar15 * ZEXT816(0xd27ae1cd5f852) +
              auVar19 * ZEXT816(0x1000003d10);
  uVar1076 = auVar1089._0_8_;
  auVar927._8_8_ = 0;
  auVar927._0_8_ = uVar1073 >> 0x34 | auVar1094._8_8_ << 0xc;
  local_78 = uVar1076 & 0xfffffffffffff;
  auVar926._8_8_ = 0;
  auVar926._0_8_ = uVar1076 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = t->n[0];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = t->n[1];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = t->n[2];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = t->n[3];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = t->n[4];
  auVar1094 = auVar23 * ZEXT816(0xa2d2ba93507) + auVar927 + auVar24 * ZEXT816(0xf1df233770c2a);
  uVar1073 = auVar1094._0_8_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = uVar1073 & 0xfffffffffffff;
  auVar1089 = auVar20 * ZEXT816(0x797962cc61f6d) + auVar926 + auVar21 * ZEXT816(0x15da14ecd47d8) +
              auVar22 * ZEXT816(0xd27ae1cd5f852) + auVar25 * ZEXT816(0x1000003d10);
  uVar1076 = auVar1089._0_8_;
  local_70 = uVar1076 & 0xfffffffffffff;
  auVar928._8_8_ = 0;
  auVar928._0_8_ = (uVar1076 >> 0x34 | auVar1089._8_8_ << 0xc) + (uVar1072 & 0xfffffffffffff);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar1073 >> 0x34 | auVar1094._8_8_ << 0xc;
  auVar928 = auVar26 * ZEXT816(0x1000003d10) + auVar928;
  uVar1072 = auVar928._0_8_;
  local_68 = uVar1072 & 0xfffffffffffff;
  local_60 = (uVar1072 >> 0x34 | auVar928._8_8_ << 0xc) + (uVar1070 & 0xffffffffffff);
  uVar1070 = t->n[0];
  uVar1072 = t->n[1];
  uVar1073 = t->n[2];
  uVar1076 = t->n[3];
  uVar1079 = t->n[4];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = uVar1070 * 2;
  auVar538._8_8_ = 0;
  auVar538._0_8_ = uVar1076;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = uVar1072 * 2;
  auVar539._8_8_ = 0;
  auVar539._0_8_ = uVar1073;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = uVar1079;
  auVar540._8_8_ = 0;
  auVar540._0_8_ = uVar1079;
  uVar1071 = SUB168(auVar29 * auVar540,0);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar1071 & 0xfffffffffffff;
  auVar1089 = auVar28 * auVar539 + auVar27 * auVar538 + auVar30 * ZEXT816(0x1000003d10);
  uVar1074 = auVar1089._0_8_;
  auVar929._8_8_ = 0;
  auVar929._0_8_ = uVar1074 >> 0x34 | auVar1089._8_8_ << 0xc;
  uVar1079 = uVar1079 * 2;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = uVar1070;
  auVar541._8_8_ = 0;
  auVar541._0_8_ = uVar1079;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar1072 * 2;
  auVar542._8_8_ = 0;
  auVar542._0_8_ = uVar1076;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = uVar1073;
  auVar543._8_8_ = 0;
  auVar543._0_8_ = uVar1073;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar1071 >> 0x34 | SUB168(auVar29 * auVar540,8) << 0xc;
  auVar1089 = auVar31 * auVar541 + auVar929 + auVar32 * auVar542 + auVar33 * auVar543 +
              auVar34 * ZEXT816(0x1000003d10);
  uVar1071 = auVar1089._0_8_;
  auVar930._8_8_ = 0;
  auVar930._0_8_ = uVar1071 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = uVar1070;
  auVar544._8_8_ = 0;
  auVar544._0_8_ = uVar1070;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar1072;
  auVar545._8_8_ = 0;
  auVar545._0_8_ = uVar1079;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = uVar1073 * 2;
  auVar546._8_8_ = 0;
  auVar546._0_8_ = uVar1076;
  auVar1089 = auVar36 * auVar545 + auVar930 + auVar37 * auVar546;
  uVar1075 = auVar1089._0_8_;
  auVar932._8_8_ = 0;
  auVar932._0_8_ = uVar1075 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar547._8_8_ = 0;
  auVar547._0_8_ = (uVar1075 & 0xfffffffffffff) << 4 | (uVar1071 & 0xfffffffffffff) >> 0x30;
  auVar1089 = auVar35 * auVar544 + ZEXT816(0x1000003d1) * auVar547;
  uVar1077 = auVar1089._0_8_;
  auVar931._8_8_ = 0;
  auVar931._0_8_ = uVar1077 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar1070 * 2;
  auVar548._8_8_ = 0;
  auVar548._0_8_ = uVar1072;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar1073;
  auVar549._8_8_ = 0;
  auVar549._0_8_ = uVar1079;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = uVar1076;
  auVar550._8_8_ = 0;
  auVar550._0_8_ = uVar1076;
  auVar1094 = auVar39 * auVar549 + auVar932 + auVar40 * auVar550;
  uVar1075 = auVar1094._0_8_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar1075 & 0xfffffffffffff;
  auVar1089 = auVar38 * auVar548 + auVar931 + auVar41 * ZEXT816(0x1000003d10);
  uVar1078 = auVar1089._0_8_;
  auVar934._8_8_ = 0;
  auVar934._0_8_ = uVar1075 >> 0x34 | auVar1094._8_8_ << 0xc;
  uStack_1d0 = uVar1078 & 0xfffffffffffff;
  auVar933._8_8_ = 0;
  auVar933._0_8_ = uVar1078 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar1070 * 2;
  auVar551._8_8_ = 0;
  auVar551._0_8_ = uVar1073;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar1072;
  auVar552._8_8_ = 0;
  auVar552._0_8_ = uVar1072;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar1076;
  auVar553._8_8_ = 0;
  auVar553._0_8_ = uVar1079;
  auVar934 = auVar44 * auVar553 + auVar934;
  uVar1070 = auVar934._0_8_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar1070 & 0xfffffffffffff;
  auVar1089 = auVar42 * auVar551 + auVar933 + auVar43 * auVar552 + auVar45 * ZEXT816(0x1000003d10);
  uVar1072 = auVar1089._0_8_;
  local_1c8 = uVar1072 & 0xfffffffffffff;
  auVar935._8_8_ = 0;
  auVar935._0_8_ = (uVar1072 >> 0x34 | auVar1089._8_8_ << 0xc) + (uVar1074 & 0xfffffffffffff);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar1070 >> 0x34 | auVar934._8_8_ << 0xc;
  auVar935 = auVar46 * ZEXT816(0x1000003d10) + auVar935;
  uVar1070 = auVar935._0_8_;
  uStack_1c0 = uVar1070 & 0xfffffffffffff;
  local_1b8 = (uVar1070 >> 0x34 | auVar935._8_8_ << 0xc) + (uVar1071 & 0xffffffffffff);
  local_1d8 = (uVar1077 & 0xfffffffffffff) + 8;
  uVar1070 = t->n[0];
  uVar1072 = t->n[1];
  uVar1073 = t->n[2];
  uVar1076 = t->n[3];
  uVar1079 = t->n[4];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = local_80;
  auVar554._8_8_ = 0;
  auVar554._0_8_ = uVar1076;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = local_78;
  auVar555._8_8_ = 0;
  auVar555._0_8_ = uVar1073;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = local_70;
  auVar556._8_8_ = 0;
  auVar556._0_8_ = uVar1072;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = local_68;
  auVar557._8_8_ = 0;
  auVar557._0_8_ = uVar1070;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = local_60;
  auVar558._8_8_ = 0;
  auVar558._0_8_ = uVar1079;
  uVar1071 = SUB168(auVar51 * auVar558,0);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar1071 & 0xfffffffffffff;
  auVar1089 = auVar48 * auVar555 + auVar47 * auVar554 + auVar49 * auVar556 + auVar50 * auVar557 +
              auVar52 * ZEXT816(0x1000003d10);
  uVar1074 = auVar1089._0_8_;
  auVar936._8_8_ = 0;
  auVar936._0_8_ = uVar1074 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = local_80;
  auVar559._8_8_ = 0;
  auVar559._0_8_ = uVar1079;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = local_78;
  auVar560._8_8_ = 0;
  auVar560._0_8_ = uVar1076;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = local_70;
  auVar561._8_8_ = 0;
  auVar561._0_8_ = uVar1073;
  auVar56._8_8_ = 0;
  auVar56._0_8_ = local_68;
  auVar562._8_8_ = 0;
  auVar562._0_8_ = uVar1072;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = local_60;
  auVar563._8_8_ = 0;
  auVar563._0_8_ = uVar1070;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = uVar1071 >> 0x34 | SUB168(auVar51 * auVar558,8) << 0xc;
  auVar1089 = auVar53 * auVar559 + auVar936 + auVar54 * auVar560 + auVar55 * auVar561 +
              auVar56 * auVar562 + auVar57 * auVar563 + auVar58 * ZEXT816(0x1000003d10);
  uVar1071 = auVar1089._0_8_;
  auVar937._8_8_ = 0;
  auVar937._0_8_ = uVar1071 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = local_80;
  auVar564._8_8_ = 0;
  auVar564._0_8_ = uVar1070;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = local_78;
  auVar565._8_8_ = 0;
  auVar565._0_8_ = uVar1079;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = local_70;
  auVar566._8_8_ = 0;
  auVar566._0_8_ = uVar1076;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = local_68;
  auVar567._8_8_ = 0;
  auVar567._0_8_ = uVar1073;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = local_60;
  auVar568._8_8_ = 0;
  auVar568._0_8_ = uVar1072;
  auVar1089 = auVar60 * auVar565 + auVar937 + auVar61 * auVar566 + auVar62 * auVar567 +
              auVar63 * auVar568;
  uVar1075 = auVar1089._0_8_;
  auVar939._8_8_ = 0;
  auVar939._0_8_ = uVar1075 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar569._8_8_ = 0;
  auVar569._0_8_ = (uVar1075 & 0xfffffffffffff) << 4 | (uVar1071 & 0xfffffffffffff) >> 0x30;
  auVar1089 = auVar59 * auVar564 + ZEXT816(0x1000003d1) * auVar569;
  uVar1077 = auVar1089._0_8_;
  auVar938._8_8_ = 0;
  auVar938._0_8_ = uVar1077 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = local_80;
  auVar570._8_8_ = 0;
  auVar570._0_8_ = uVar1072;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = local_78;
  auVar571._8_8_ = 0;
  auVar571._0_8_ = uVar1070;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = local_70;
  auVar572._8_8_ = 0;
  auVar572._0_8_ = uVar1079;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = local_68;
  auVar573._8_8_ = 0;
  auVar573._0_8_ = uVar1076;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = local_60;
  auVar574._8_8_ = 0;
  auVar574._0_8_ = uVar1073;
  auVar1094 = auVar66 * auVar572 + auVar939 + auVar67 * auVar573 + auVar68 * auVar574;
  uVar1075 = auVar1094._0_8_;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = uVar1075 & 0xfffffffffffff;
  auVar1089 = auVar64 * auVar570 + auVar938 + auVar65 * auVar571 + auVar69 * ZEXT816(0x1000003d10);
  uVar1078 = auVar1089._0_8_;
  auVar941._8_8_ = 0;
  auVar941._0_8_ = uVar1075 >> 0x34 | auVar1094._8_8_ << 0xc;
  auVar940._8_8_ = 0;
  auVar940._0_8_ = uVar1078 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = local_80;
  auVar575._8_8_ = 0;
  auVar575._0_8_ = uVar1073;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = local_78;
  auVar576._8_8_ = 0;
  auVar576._0_8_ = uVar1072;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = local_70;
  auVar577._8_8_ = 0;
  auVar577._0_8_ = uVar1070;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = local_68;
  auVar578._8_8_ = 0;
  auVar578._0_8_ = uVar1079;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = local_60;
  auVar579._8_8_ = 0;
  auVar579._0_8_ = uVar1076;
  auVar1094 = auVar73 * auVar578 + auVar941 + auVar74 * auVar579;
  uVar1070 = auVar1094._0_8_;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = uVar1070 & 0xfffffffffffff;
  auVar1089 = auVar70 * auVar575 + auVar940 + auVar71 * auVar576 + auVar72 * auVar577 +
              auVar75 * ZEXT816(0x1000003d10);
  uVar1072 = auVar1089._0_8_;
  auVar942._8_8_ = 0;
  auVar942._0_8_ = (uVar1072 >> 0x34 | auVar1089._8_8_ << 0xc) + (uVar1074 & 0xfffffffffffff);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = uVar1070 >> 0x34 | auVar1094._8_8_ << 0xc;
  auVar942 = auVar76 * ZEXT816(0x1000003d10) + auVar942;
  uVar1070 = auVar942._0_8_;
  local_58 = 0x3ffffbfffff0bc - (uVar1077 & 0xfffffffffffff);
  lStack_50 = 0x3ffffffffffffc - (uVar1078 & 0xfffffffffffff);
  local_48 = 0x3ffffffffffffc - (uVar1072 & 0xfffffffffffff);
  lStack_40 = 0x3ffffffffffffc - (uVar1070 & 0xfffffffffffff);
  local_38 = 0x3fffffffffffc -
             ((uVar1070 >> 0x34 | auVar942._8_8_ << 0xc) + (uVar1071 & 0xffffffffffff));
  auVar77._8_8_ = 0;
  auVar77._0_8_ = local_1d8;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = uStack_1d0;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = local_1c8;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uStack_1c0;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = local_1b8;
  uVar1070 = SUB168(auVar81 * ZEXT816(0x851695d49a83),0);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = uVar1070 & 0xfffffffffffff;
  auVar1089 = auVar78 * ZEXT816(0x3cbcb16630fb6) + auVar77 * ZEXT816(0xf8ef919bb8615) +
              auVar79 * ZEXT816(0x8aed0a766a3ec) + auVar80 * ZEXT816(0x693d68e6afa40) +
              auVar82 * ZEXT816(0x1000003d10);
  uVar1072 = auVar1089._0_8_;
  auVar943._8_8_ = 0;
  auVar943._0_8_ = uVar1072 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = local_1d8;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = uStack_1d0;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = local_1c8;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uStack_1c0;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = local_1b8;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = uVar1070 >> 0x34 | SUB168(auVar81 * ZEXT816(0x851695d49a83),8) << 0xc;
  auVar1089 = auVar83 * ZEXT816(0x851695d49a83) + auVar943 + auVar84 * ZEXT816(0xf8ef919bb8615) +
              auVar85 * ZEXT816(0x3cbcb16630fb6) + auVar86 * ZEXT816(0x8aed0a766a3ec) +
              auVar87 * ZEXT816(0x693d68e6afa40) + auVar88 * ZEXT816(0x1000003d10);
  uVar1070 = auVar1089._0_8_;
  auVar944._8_8_ = 0;
  auVar944._0_8_ = uVar1070 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = local_1d8;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = uStack_1d0;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = local_1c8;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uStack_1c0;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = local_1b8;
  auVar1089 = auVar90 * ZEXT816(0x851695d49a83) + auVar944 + auVar91 * ZEXT816(0xf8ef919bb8615) +
              auVar92 * ZEXT816(0x3cbcb16630fb6) + auVar93 * ZEXT816(0x8aed0a766a3ec);
  uVar1073 = auVar1089._0_8_;
  auVar946._8_8_ = 0;
  auVar946._0_8_ = uVar1073 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar580._8_8_ = 0;
  auVar580._0_8_ = (uVar1073 & 0xfffffffffffff) << 4 | (uVar1070 & 0xfffffffffffff) >> 0x30;
  auVar1089 = auVar89 * ZEXT816(0x693d68e6afa40) + ZEXT816(0x1000003d1) * auVar580;
  uVar1076 = auVar1089._0_8_;
  auVar945._8_8_ = 0;
  auVar945._0_8_ = uVar1076 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = local_1d8;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = uStack_1d0;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = local_1c8;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = uStack_1c0;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = local_1b8;
  auVar1094 = auVar96 * ZEXT816(0x851695d49a83) + auVar946 + auVar97 * ZEXT816(0xf8ef919bb8615) +
              auVar98 * ZEXT816(0x3cbcb16630fb6);
  uVar1073 = auVar1094._0_8_;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = uVar1073 & 0xfffffffffffff;
  auVar1089 = auVar94 * ZEXT816(0x8aed0a766a3ec) + auVar945 + auVar95 * ZEXT816(0x693d68e6afa40) +
              auVar99 * ZEXT816(0x1000003d10);
  uVar1079 = auVar1089._0_8_;
  auVar948._8_8_ = 0;
  auVar948._0_8_ = uVar1073 >> 0x34 | auVar1094._8_8_ << 0xc;
  auVar947._8_8_ = 0;
  auVar947._0_8_ = uVar1079 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = local_1d8;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = uStack_1d0;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = local_1c8;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = uStack_1c0;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = local_1b8;
  auVar1094 = auVar103 * ZEXT816(0x851695d49a83) + auVar948 + auVar104 * ZEXT816(0xf8ef919bb8615);
  uVar1073 = auVar1094._0_8_;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = uVar1073 & 0xfffffffffffff;
  auVar1089 = auVar100 * ZEXT816(0x3cbcb16630fb6) + auVar947 + auVar101 * ZEXT816(0x8aed0a766a3ec) +
              auVar102 * ZEXT816(0x693d68e6afa40) + auVar105 * ZEXT816(0x1000003d10);
  uVar1071 = auVar1089._0_8_;
  auVar949._8_8_ = 0;
  auVar949._0_8_ = (uVar1071 >> 0x34 | auVar1089._8_8_ << 0xc) + (uVar1072 & 0xfffffffffffff);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = uVar1073 >> 0x34 | auVar1094._8_8_ << 0xc;
  auVar949 = auVar106 * ZEXT816(0x1000003d10) + auVar949;
  uVar1072 = auVar949._0_8_;
  local_108 = (uVar1076 & 0xfffffffffffff) + local_58;
  uStack_100 = (uVar1079 & 0xfffffffffffff) + lStack_50;
  local_f8 = (uVar1071 & 0xfffffffffffff) + local_48;
  uStack_f0 = (uVar1072 & 0xfffffffffffff) + lStack_40;
  local_e8 = (uVar1072 >> 0x34 | auVar949._8_8_ << 0xc) + (uVar1070 & 0xffffffffffff) + local_38;
  local_188 = 0xbffff3ffffd234 - (local_108 + local_1d8);
  uStack_180 = 0xbffffffffffff4 - (uStack_100 + uStack_1d0);
  local_178 = 0xbffffffffffff4 - (local_f8 + local_1c8);
  uStack_170 = 0xbffffffffffff4 - (uStack_f0 + uStack_1c0);
  local_168 = 0xbfffffffffff4 - (local_e8 + local_1b8);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = t->n[0];
  auVar108._8_8_ = 0;
  auVar108._0_8_ = t->n[1];
  auVar109._8_8_ = 0;
  auVar109._0_8_ = t->n[2];
  auVar110._8_8_ = 0;
  auVar110._0_8_ = t->n[3];
  auVar111._8_8_ = 0;
  auVar111._0_8_ = t->n[4];
  uVar1070 = SUB168(auVar111 * ZEXT816(0xa2d2ba93507),0);
  auVar112._8_8_ = 0;
  auVar112._0_8_ = uVar1070 & 0xfffffffffffff;
  auVar1089 = auVar108 * ZEXT816(0x797962cc61f6d) + auVar107 * ZEXT816(0xf1df233770c2a) +
              auVar109 * ZEXT816(0x15da14ecd47d8) + auVar110 * ZEXT816(0xd27ae1cd5f852) +
              auVar112 * ZEXT816(0x1000003d10);
  uVar1079 = auVar1089._0_8_;
  auVar950._8_8_ = 0;
  auVar950._0_8_ = uVar1079 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = t->n[0];
  auVar114._8_8_ = 0;
  auVar114._0_8_ = t->n[1];
  auVar115._8_8_ = 0;
  auVar115._0_8_ = t->n[2];
  auVar116._8_8_ = 0;
  auVar116._0_8_ = t->n[3];
  auVar117._8_8_ = 0;
  auVar117._0_8_ = t->n[4];
  auVar118._8_8_ = 0;
  auVar118._0_8_ = uVar1070 >> 0x34 | SUB168(auVar111 * ZEXT816(0xa2d2ba93507),8) << 0xc;
  auVar1089 = auVar113 * ZEXT816(0xa2d2ba93507) + auVar950 + auVar114 * ZEXT816(0xf1df233770c2a) +
              auVar115 * ZEXT816(0x797962cc61f6d) + auVar116 * ZEXT816(0x15da14ecd47d8) +
              auVar117 * ZEXT816(0xd27ae1cd5f852) + auVar118 * ZEXT816(0x1000003d10);
  uVar1070 = auVar1089._0_8_;
  auVar951._8_8_ = 0;
  auVar951._0_8_ = uVar1070 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = t->n[0];
  auVar120._8_8_ = 0;
  auVar120._0_8_ = t->n[1];
  auVar121._8_8_ = 0;
  auVar121._0_8_ = t->n[2];
  auVar122._8_8_ = 0;
  auVar122._0_8_ = t->n[3];
  auVar123._8_8_ = 0;
  auVar123._0_8_ = t->n[4];
  auVar1089 = auVar120 * ZEXT816(0xa2d2ba93507) + auVar951 + auVar121 * ZEXT816(0xf1df233770c2a) +
              auVar122 * ZEXT816(0x797962cc61f6d) + auVar123 * ZEXT816(0x15da14ecd47d8);
  uVar1072 = auVar1089._0_8_;
  auVar953._8_8_ = 0;
  auVar953._0_8_ = uVar1072 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar581._8_8_ = 0;
  auVar581._0_8_ = (uVar1072 & 0xfffffffffffff) << 4 | (uVar1070 & 0xfffffffffffff) >> 0x30;
  auVar1089 = auVar119 * ZEXT816(0xd27ae1cd5f852) + ZEXT816(0x1000003d1) * auVar581;
  uVar1073 = auVar1089._0_8_;
  uVar1072 = uVar1073 & 0xfffffffffffff;
  auVar952._8_8_ = 0;
  auVar952._0_8_ = uVar1073 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = t->n[0];
  auVar125._8_8_ = 0;
  auVar125._0_8_ = t->n[1];
  auVar126._8_8_ = 0;
  auVar126._0_8_ = t->n[2];
  auVar127._8_8_ = 0;
  auVar127._0_8_ = t->n[3];
  auVar128._8_8_ = 0;
  auVar128._0_8_ = t->n[4];
  auVar1094 = auVar126 * ZEXT816(0xa2d2ba93507) + auVar953 + auVar127 * ZEXT816(0xf1df233770c2a) +
              auVar128 * ZEXT816(0x797962cc61f6d);
  uVar1073 = auVar1094._0_8_;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = uVar1073 & 0xfffffffffffff;
  auVar1089 = auVar124 * ZEXT816(0x15da14ecd47d8) + auVar952 + auVar125 * ZEXT816(0xd27ae1cd5f852) +
              auVar129 * ZEXT816(0x1000003d10);
  uVar1076 = auVar1089._0_8_;
  auVar955._8_8_ = 0;
  auVar955._0_8_ = uVar1073 >> 0x34 | auVar1094._8_8_ << 0xc;
  uVar1073 = uVar1076 & 0xfffffffffffff;
  auVar954._8_8_ = 0;
  auVar954._0_8_ = uVar1076 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = t->n[0];
  auVar131._8_8_ = 0;
  auVar131._0_8_ = t->n[1];
  auVar132._8_8_ = 0;
  auVar132._0_8_ = t->n[2];
  auVar133._8_8_ = 0;
  auVar133._0_8_ = t->n[3];
  auVar134._8_8_ = 0;
  auVar134._0_8_ = t->n[4];
  auVar1094 = auVar133 * ZEXT816(0xa2d2ba93507) + auVar955 + auVar134 * ZEXT816(0xf1df233770c2a);
  uVar1071 = auVar1094._0_8_;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = uVar1071 & 0xfffffffffffff;
  auVar1089 = auVar130 * ZEXT816(0x797962cc61f6d) + auVar954 + auVar131 * ZEXT816(0x15da14ecd47d8) +
              auVar132 * ZEXT816(0xd27ae1cd5f852) + auVar135 * ZEXT816(0x1000003d10);
  uVar1074 = auVar1089._0_8_;
  uVar1076 = uVar1074 & 0xfffffffffffff;
  auVar956._8_8_ = 0;
  auVar956._0_8_ = (uVar1074 >> 0x34 | auVar1089._8_8_ << 0xc) + (uVar1079 & 0xfffffffffffff);
  auVar136._8_8_ = 0;
  auVar136._0_8_ = uVar1071 >> 0x34 | auVar1094._8_8_ << 0xc;
  auVar956 = auVar136 * ZEXT816(0x1000003d10) + auVar956;
  uVar1071 = auVar956._0_8_;
  uVar1079 = uVar1071 & 0xfffffffffffff;
  uVar1070 = (uVar1071 >> 0x34 | auVar956._8_8_ << 0xc) + (uVar1070 & 0xffffffffffff);
  auVar137._8_8_ = 0;
  auVar137._0_8_ = uVar1072 * 2;
  auVar582._8_8_ = 0;
  auVar582._0_8_ = uVar1079;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = uVar1073 * 2;
  auVar583._8_8_ = 0;
  auVar583._0_8_ = uVar1076;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = uVar1070;
  auVar584._8_8_ = 0;
  auVar584._0_8_ = uVar1070;
  uVar1071 = SUB168(auVar139 * auVar584,0);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = uVar1071 & 0xfffffffffffff;
  auVar1089 = auVar138 * auVar583 + auVar137 * auVar582 + auVar140 * ZEXT816(0x1000003d10);
  uVar1074 = auVar1089._0_8_;
  auVar957._8_8_ = 0;
  auVar957._0_8_ = uVar1074 >> 0x34 | auVar1089._8_8_ << 0xc;
  uVar1070 = uVar1070 * 2;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = uVar1072;
  auVar585._8_8_ = 0;
  auVar585._0_8_ = uVar1070;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = uVar1073 * 2;
  auVar586._8_8_ = 0;
  auVar586._0_8_ = uVar1079;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = uVar1076;
  auVar587._8_8_ = 0;
  auVar587._0_8_ = uVar1076;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = uVar1071 >> 0x34 | SUB168(auVar139 * auVar584,8) << 0xc;
  auVar1089 = auVar141 * auVar585 + auVar957 + auVar142 * auVar586 + auVar143 * auVar587 +
              auVar144 * ZEXT816(0x1000003d10);
  uVar1071 = auVar1089._0_8_;
  auVar958._8_8_ = 0;
  auVar958._0_8_ = uVar1071 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = uVar1072;
  auVar588._8_8_ = 0;
  auVar588._0_8_ = uVar1072;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = uVar1073;
  auVar589._8_8_ = 0;
  auVar589._0_8_ = uVar1070;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = uVar1076 * 2;
  auVar590._8_8_ = 0;
  auVar590._0_8_ = uVar1079;
  auVar1089 = auVar146 * auVar589 + auVar958 + auVar147 * auVar590;
  uVar1075 = auVar1089._0_8_;
  auVar960._8_8_ = 0;
  auVar960._0_8_ = uVar1075 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar591._8_8_ = 0;
  auVar591._0_8_ = (uVar1075 & 0xfffffffffffff) << 4 | (uVar1071 & 0xfffffffffffff) >> 0x30;
  auVar1089 = auVar145 * auVar588 + ZEXT816(0x1000003d1) * auVar591;
  uVar1075 = auVar1089._0_8_;
  local_a8 = uVar1075 & 0xfffffffffffff;
  auVar959._8_8_ = 0;
  auVar959._0_8_ = uVar1075 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = uVar1072 * 2;
  auVar592._8_8_ = 0;
  auVar592._0_8_ = uVar1073;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = uVar1076;
  auVar593._8_8_ = 0;
  auVar593._0_8_ = uVar1070;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = uVar1079;
  auVar594._8_8_ = 0;
  auVar594._0_8_ = uVar1079;
  auVar1094 = auVar149 * auVar593 + auVar960 + auVar150 * auVar594;
  uVar1075 = auVar1094._0_8_;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = uVar1075 & 0xfffffffffffff;
  auVar1089 = auVar148 * auVar592 + auVar959 + auVar151 * ZEXT816(0x1000003d10);
  uVar1077 = auVar1089._0_8_;
  auVar962._8_8_ = 0;
  auVar962._0_8_ = uVar1075 >> 0x34 | auVar1094._8_8_ << 0xc;
  uStack_a0 = uVar1077 & 0xfffffffffffff;
  auVar961._8_8_ = 0;
  auVar961._0_8_ = uVar1077 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = uVar1072 * 2;
  auVar595._8_8_ = 0;
  auVar595._0_8_ = uVar1076;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = uVar1073;
  auVar596._8_8_ = 0;
  auVar596._0_8_ = uVar1073;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = uVar1079;
  auVar597._8_8_ = 0;
  auVar597._0_8_ = uVar1070;
  auVar962 = auVar154 * auVar597 + auVar962;
  uVar1070 = auVar962._0_8_;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = uVar1070 & 0xfffffffffffff;
  auVar1089 = auVar152 * auVar595 + auVar961 + auVar153 * auVar596 +
              auVar155 * ZEXT816(0x1000003d10);
  uVar1072 = auVar1089._0_8_;
  local_98 = uVar1072 & 0xfffffffffffff;
  auVar963._8_8_ = 0;
  auVar963._0_8_ = (uVar1072 >> 0x34 | auVar1089._8_8_ << 0xc) + (uVar1074 & 0xfffffffffffff);
  auVar156._8_8_ = 0;
  auVar156._0_8_ = uVar1070 >> 0x34 | auVar962._8_8_ << 0xc;
  auVar963 = auVar156 * ZEXT816(0x1000003d10) + auVar963;
  uVar1070 = auVar963._0_8_;
  uStack_90 = uVar1070 & 0xfffffffffffff;
  local_88 = (uVar1070 >> 0x34 | auVar963._8_8_ << 0xc) + (uVar1071 & 0xffffffffffff);
  auVar157._8_8_ = 0;
  auVar157._0_8_ = local_1d8 * 2;
  auVar598._8_8_ = 0;
  auVar598._0_8_ = uStack_1c0;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = uStack_1d0 * 2;
  auVar599._8_8_ = 0;
  auVar599._0_8_ = local_1c8;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = local_1b8;
  auVar600._8_8_ = 0;
  auVar600._0_8_ = local_1b8;
  uVar1072 = SUB168(auVar159 * auVar600,0);
  auVar160._8_8_ = 0;
  auVar160._0_8_ = uVar1072 & 0xfffffffffffff;
  auVar1089 = auVar158 * auVar599 + auVar157 * auVar598 + auVar160 * ZEXT816(0x1000003d10);
  uVar1073 = auVar1089._0_8_;
  auVar964._8_8_ = 0;
  auVar964._0_8_ = uVar1073 >> 0x34 | auVar1089._8_8_ << 0xc;
  uVar1070 = local_1b8 * 2;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = local_1d8;
  auVar601._8_8_ = 0;
  auVar601._0_8_ = uVar1070;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = uStack_1d0 * 2;
  auVar602._8_8_ = 0;
  auVar602._0_8_ = uStack_1c0;
  auVar163._8_8_ = 0;
  auVar163._0_8_ = local_1c8;
  auVar603._8_8_ = 0;
  auVar603._0_8_ = local_1c8;
  auVar164._8_8_ = 0;
  auVar164._0_8_ = uVar1072 >> 0x34 | SUB168(auVar159 * auVar600,8) << 0xc;
  auVar1089 = auVar161 * auVar601 + auVar964 + auVar162 * auVar602 + auVar163 * auVar603 +
              auVar164 * ZEXT816(0x1000003d10);
  uVar1072 = auVar1089._0_8_;
  auVar965._8_8_ = 0;
  auVar965._0_8_ = uVar1072 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar165._8_8_ = 0;
  auVar165._0_8_ = local_1d8;
  auVar604._8_8_ = 0;
  auVar604._0_8_ = local_1d8;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = uStack_1d0;
  auVar605._8_8_ = 0;
  auVar605._0_8_ = uVar1070;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = local_1c8 * 2;
  auVar606._8_8_ = 0;
  auVar606._0_8_ = uStack_1c0;
  auVar1089 = auVar166 * auVar605 + auVar965 + auVar167 * auVar606;
  uVar1076 = auVar1089._0_8_;
  auVar967._8_8_ = 0;
  auVar967._0_8_ = uVar1076 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar607._8_8_ = 0;
  auVar607._0_8_ = (uVar1076 & 0xfffffffffffff) << 4 | (uVar1072 & 0xfffffffffffff) >> 0x30;
  auVar1089 = auVar165 * auVar604 + ZEXT816(0x1000003d1) * auVar607;
  uVar1079 = auVar1089._0_8_;
  auVar966._8_8_ = 0;
  auVar966._0_8_ = uVar1079 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = local_1d8 * 2;
  auVar608._8_8_ = 0;
  auVar608._0_8_ = uStack_1d0;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = local_1c8;
  auVar609._8_8_ = 0;
  auVar609._0_8_ = uVar1070;
  auVar170._8_8_ = 0;
  auVar170._0_8_ = uStack_1c0;
  auVar610._8_8_ = 0;
  auVar610._0_8_ = uStack_1c0;
  auVar1094 = auVar169 * auVar609 + auVar967 + auVar170 * auVar610;
  uVar1076 = auVar1094._0_8_;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = uVar1076 & 0xfffffffffffff;
  auVar1089 = auVar168 * auVar608 + auVar966 + auVar171 * ZEXT816(0x1000003d10);
  uVar1071 = auVar1089._0_8_;
  auVar969._8_8_ = 0;
  auVar969._0_8_ = uVar1076 >> 0x34 | auVar1094._8_8_ << 0xc;
  auVar968._8_8_ = 0;
  auVar968._0_8_ = uVar1071 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = local_1d8 * 2;
  auVar611._8_8_ = 0;
  auVar611._0_8_ = local_1c8;
  auVar173._8_8_ = 0;
  auVar173._0_8_ = uStack_1d0;
  auVar612._8_8_ = 0;
  auVar612._0_8_ = uStack_1d0;
  auVar174._8_8_ = 0;
  auVar174._0_8_ = uStack_1c0;
  auVar613._8_8_ = 0;
  auVar613._0_8_ = uVar1070;
  auVar969 = auVar174 * auVar613 + auVar969;
  uVar1070 = auVar969._0_8_;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = uVar1070 & 0xfffffffffffff;
  auVar1089 = auVar172 * auVar611 + auVar968 + auVar173 * auVar612 +
              auVar175 * ZEXT816(0x1000003d10);
  uVar1076 = auVar1089._0_8_;
  auVar970._8_8_ = 0;
  auVar970._0_8_ = (uVar1076 >> 0x34 | auVar1089._8_8_ << 0xc) + (uVar1073 & 0xfffffffffffff);
  auVar176._8_8_ = 0;
  auVar176._0_8_ = uVar1070 >> 0x34 | auVar969._8_8_ << 0xc;
  auVar970 = auVar176 * ZEXT816(0x1000003d10) + auVar970;
  uVar1070 = auVar970._0_8_;
  local_208 = (uVar1079 & 0xfffffffffffff) + local_a8;
  uStack_200 = (uVar1071 & 0xfffffffffffff) + uStack_a0;
  local_1f8 = (uVar1076 & 0xfffffffffffff) + local_98;
  uStack_1f0 = (uVar1070 & 0xfffffffffffff) + uStack_90;
  local_1e8 = (uVar1070 >> 0x34 | auVar970._8_8_ << 0xc) + (uVar1072 & 0xffffffffffff) + local_88;
  auVar177._8_8_ = 0;
  auVar177._0_8_ = local_1d8;
  auVar614._8_8_ = 0;
  auVar614._0_8_ = uStack_90;
  auVar178._8_8_ = 0;
  auVar178._0_8_ = uStack_1d0;
  auVar615._8_8_ = 0;
  auVar615._0_8_ = local_98;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = local_1c8;
  auVar616._8_8_ = 0;
  auVar616._0_8_ = uStack_a0;
  auVar180._8_8_ = 0;
  auVar180._0_8_ = uStack_1c0;
  auVar617._8_8_ = 0;
  auVar617._0_8_ = local_a8;
  auVar181._8_8_ = 0;
  auVar181._0_8_ = local_1b8;
  auVar618._8_8_ = 0;
  auVar618._0_8_ = local_88;
  uVar1070 = SUB168(auVar181 * auVar618,0);
  auVar182._8_8_ = 0;
  auVar182._0_8_ = uVar1070 & 0xfffffffffffff;
  auVar1089 = auVar178 * auVar615 + auVar177 * auVar614 + auVar179 * auVar616 + auVar180 * auVar617
              + auVar182 * ZEXT816(0x1000003d10);
  uVar1072 = auVar1089._0_8_;
  local_238._0_8_ = uVar1072 & 0xfffffffffffff;
  auVar971._8_8_ = 0;
  auVar971._0_8_ = uVar1072 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = local_1d8;
  auVar619._8_8_ = 0;
  auVar619._0_8_ = local_88;
  auVar184._8_8_ = 0;
  auVar184._0_8_ = uStack_1d0;
  auVar620._8_8_ = 0;
  auVar620._0_8_ = uStack_90;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = local_1c8;
  auVar621._8_8_ = 0;
  auVar621._0_8_ = local_98;
  auVar186._8_8_ = 0;
  auVar186._0_8_ = uStack_1c0;
  auVar622._8_8_ = 0;
  auVar622._0_8_ = uStack_a0;
  auVar187._8_8_ = 0;
  auVar187._0_8_ = local_1b8;
  auVar623._8_8_ = 0;
  auVar623._0_8_ = local_a8;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = uVar1070 >> 0x34 | SUB168(auVar181 * auVar618,8) << 0xc;
  auVar1089 = auVar183 * auVar619 + auVar971 + auVar184 * auVar620 + auVar185 * auVar621 +
              auVar186 * auVar622 + auVar187 * auVar623 + auVar188 * ZEXT816(0x1000003d10);
  uVar1070 = auVar1089._0_8_;
  auVar972._8_8_ = 0;
  auVar972._0_8_ = uVar1070 >> 0x34 | auVar1089._8_8_ << 0xc;
  local_268 = uVar1070 & 0xffffffffffff;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = local_1d8;
  auVar624._8_8_ = 0;
  auVar624._0_8_ = local_a8;
  auVar190._8_8_ = 0;
  auVar190._0_8_ = uStack_1d0;
  auVar625._8_8_ = 0;
  auVar625._0_8_ = local_88;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = local_1c8;
  auVar626._8_8_ = 0;
  auVar626._0_8_ = uStack_90;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = uStack_1c0;
  auVar627._8_8_ = 0;
  auVar627._0_8_ = local_98;
  auVar193._8_8_ = 0;
  auVar193._0_8_ = local_1b8;
  auVar628._8_8_ = 0;
  auVar628._0_8_ = uStack_a0;
  auVar1089 = auVar190 * auVar625 + auVar972 + auVar191 * auVar626 + auVar192 * auVar627 +
              auVar193 * auVar628;
  uVar1072 = auVar1089._0_8_;
  auVar974._8_8_ = 0;
  auVar974._0_8_ = uVar1072 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar629._8_8_ = 0;
  auVar629._0_8_ = (uVar1072 & 0xfffffffffffff) << 4 | (uVar1070 & 0xfffffffffffff) >> 0x30;
  auVar1089 = auVar189 * auVar624 + ZEXT816(0x1000003d1) * auVar629;
  uVar1070 = auVar1089._0_8_;
  local_160.n[0] = uVar1070 & 0xfffffffffffff;
  auVar973._8_8_ = 0;
  auVar973._0_8_ = uVar1070 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = local_1d8;
  auVar630._8_8_ = 0;
  auVar630._0_8_ = uStack_a0;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = uStack_1d0;
  auVar631._8_8_ = 0;
  auVar631._0_8_ = local_a8;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = local_1c8;
  auVar632._8_8_ = 0;
  auVar632._0_8_ = local_88;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = uStack_1c0;
  auVar633._8_8_ = 0;
  auVar633._0_8_ = uStack_90;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = local_1b8;
  auVar634._8_8_ = 0;
  auVar634._0_8_ = local_98;
  auVar1094 = auVar196 * auVar632 + auVar974 + auVar197 * auVar633 + auVar198 * auVar634;
  uVar1070 = auVar1094._0_8_;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = uVar1070 & 0xfffffffffffff;
  auVar1089 = auVar194 * auVar630 + auVar973 + auVar195 * auVar631 +
              auVar199 * ZEXT816(0x1000003d10);
  uVar1072 = auVar1089._0_8_;
  auVar976._8_8_ = 0;
  auVar976._0_8_ = uVar1070 >> 0x34 | auVar1094._8_8_ << 0xc;
  local_160.n[1] = uVar1072 & 0xfffffffffffff;
  auVar975._8_8_ = 0;
  auVar975._0_8_ = uVar1072 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = local_1d8;
  auVar635._8_8_ = 0;
  auVar635._0_8_ = local_98;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = uStack_1d0;
  auVar636._8_8_ = 0;
  auVar636._0_8_ = uStack_a0;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = local_1c8;
  auVar637._8_8_ = 0;
  auVar637._0_8_ = local_a8;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = uStack_1c0;
  auVar638._8_8_ = 0;
  auVar638._0_8_ = local_88;
  auVar204._8_8_ = 0;
  auVar204._0_8_ = local_1b8;
  auVar639._8_8_ = 0;
  auVar639._0_8_ = uStack_90;
  auVar1094 = auVar203 * auVar638 + auVar976 + auVar204 * auVar639;
  uVar1070 = auVar1094._0_8_;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = uVar1070 & 0xfffffffffffff;
  auVar1089 = auVar200 * auVar635 + auVar975 + auVar201 * auVar636 + auVar202 * auVar637 +
              auVar205 * ZEXT816(0x1000003d10);
  uVar1072 = auVar1089._0_8_;
  local_160.n[2] = uVar1072 & 0xfffffffffffff;
  auVar977._8_8_ = 0;
  auVar977._0_8_ = (uVar1072 >> 0x34 | auVar1089._8_8_ << 0xc) + local_238._0_8_;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = uVar1070 >> 0x34 | auVar1094._8_8_ << 0xc;
  auVar977 = auVar206 * ZEXT816(0x1000003d10) + auVar977;
  uVar1070 = auVar977._0_8_;
  local_160.n[3] = uVar1070 & 0xfffffffffffff;
  local_160.n[4] = (uVar1070 >> 0x34 | auVar977._8_8_ << 0xc) + local_268;
  secp256k1_fe_inv(&local_160,&local_160);
  auVar207._8_8_ = 0;
  auVar207._0_8_ = local_a8;
  auVar640._8_8_ = 0;
  auVar640._0_8_ = uStack_f0;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = uStack_a0;
  auVar641._8_8_ = 0;
  auVar641._0_8_ = local_f8;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = local_98;
  auVar642._8_8_ = 0;
  auVar642._0_8_ = uStack_100;
  auVar210._8_8_ = 0;
  auVar210._0_8_ = uStack_90;
  auVar643._8_8_ = 0;
  auVar643._0_8_ = local_108;
  auVar211._8_8_ = 0;
  auVar211._0_8_ = local_88;
  auVar644._8_8_ = 0;
  auVar644._0_8_ = local_e8;
  uVar1070 = SUB168(auVar211 * auVar644,0);
  auVar212._8_8_ = 0;
  auVar212._0_8_ = uVar1070 & 0xfffffffffffff;
  auVar1089 = auVar208 * auVar641 + auVar207 * auVar640 + auVar209 * auVar642 + auVar210 * auVar643
              + auVar212 * ZEXT816(0x1000003d10);
  uVar1076 = auVar1089._0_8_;
  auVar978._8_8_ = 0;
  auVar978._0_8_ = uVar1076 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar213._8_8_ = 0;
  auVar213._0_8_ = local_a8;
  auVar645._8_8_ = 0;
  auVar645._0_8_ = local_e8;
  auVar214._8_8_ = 0;
  auVar214._0_8_ = uStack_a0;
  auVar646._8_8_ = 0;
  auVar646._0_8_ = uStack_f0;
  auVar215._8_8_ = 0;
  auVar215._0_8_ = local_98;
  auVar647._8_8_ = 0;
  auVar647._0_8_ = local_f8;
  auVar216._8_8_ = 0;
  auVar216._0_8_ = uStack_90;
  auVar648._8_8_ = 0;
  auVar648._0_8_ = uStack_100;
  auVar217._8_8_ = 0;
  auVar217._0_8_ = local_88;
  auVar649._8_8_ = 0;
  auVar649._0_8_ = local_108;
  auVar218._8_8_ = 0;
  auVar218._0_8_ = uVar1070 >> 0x34 | SUB168(auVar211 * auVar644,8) << 0xc;
  auVar1089 = auVar213 * auVar645 + auVar978 + auVar214 * auVar646 + auVar215 * auVar647 +
              auVar216 * auVar648 + auVar217 * auVar649 + auVar218 * ZEXT816(0x1000003d10);
  uVar1079 = auVar1089._0_8_;
  auVar979._8_8_ = 0;
  auVar979._0_8_ = uVar1079 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = local_a8;
  auVar650._8_8_ = 0;
  auVar650._0_8_ = local_108;
  auVar220._8_8_ = 0;
  auVar220._0_8_ = uStack_a0;
  auVar651._8_8_ = 0;
  auVar651._0_8_ = local_e8;
  auVar221._8_8_ = 0;
  auVar221._0_8_ = local_98;
  auVar652._8_8_ = 0;
  auVar652._0_8_ = uStack_f0;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = uStack_90;
  auVar653._8_8_ = 0;
  auVar653._0_8_ = local_f8;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = local_88;
  auVar654._8_8_ = 0;
  auVar654._0_8_ = uStack_100;
  auVar1089 = auVar220 * auVar651 + auVar979 + auVar221 * auVar652 + auVar222 * auVar653 +
              auVar223 * auVar654;
  uVar1070 = auVar1089._0_8_;
  auVar981._8_8_ = 0;
  auVar981._0_8_ = uVar1070 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar655._8_8_ = 0;
  auVar655._0_8_ = (uVar1070 & 0xfffffffffffff) << 4 | (uVar1079 & 0xfffffffffffff) >> 0x30;
  auVar1089 = auVar219 * auVar650 + ZEXT816(0x1000003d1) * auVar655;
  uVar1072 = auVar1089._0_8_;
  uVar1070 = uVar1072 & 0xfffffffffffff;
  auVar980._8_8_ = 0;
  auVar980._0_8_ = uVar1072 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar224._8_8_ = 0;
  auVar224._0_8_ = local_a8;
  auVar656._8_8_ = 0;
  auVar656._0_8_ = uStack_100;
  auVar225._8_8_ = 0;
  auVar225._0_8_ = uStack_a0;
  auVar657._8_8_ = 0;
  auVar657._0_8_ = local_108;
  auVar226._8_8_ = 0;
  auVar226._0_8_ = local_98;
  auVar658._8_8_ = 0;
  auVar658._0_8_ = local_e8;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = uStack_90;
  auVar659._8_8_ = 0;
  auVar659._0_8_ = uStack_f0;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = local_88;
  auVar660._8_8_ = 0;
  auVar660._0_8_ = local_f8;
  auVar1094 = auVar226 * auVar658 + auVar981 + auVar227 * auVar659 + auVar228 * auVar660;
  uVar1072 = auVar1094._0_8_;
  auVar229._8_8_ = 0;
  auVar229._0_8_ = uVar1072 & 0xfffffffffffff;
  auVar1089 = auVar224 * auVar656 + auVar980 + auVar225 * auVar657 +
              auVar229 * ZEXT816(0x1000003d10);
  uVar1073 = auVar1089._0_8_;
  auVar983._8_8_ = 0;
  auVar983._0_8_ = uVar1072 >> 0x34 | auVar1094._8_8_ << 0xc;
  uVar1072 = uVar1073 & 0xfffffffffffff;
  auVar982._8_8_ = 0;
  auVar982._0_8_ = uVar1073 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar230._8_8_ = 0;
  auVar230._0_8_ = local_a8;
  auVar661._8_8_ = 0;
  auVar661._0_8_ = local_f8;
  auVar231._8_8_ = 0;
  auVar231._0_8_ = uStack_a0;
  auVar662._8_8_ = 0;
  auVar662._0_8_ = uStack_100;
  auVar232._8_8_ = 0;
  auVar232._0_8_ = local_98;
  auVar663._8_8_ = 0;
  auVar663._0_8_ = local_108;
  auVar233._8_8_ = 0;
  auVar233._0_8_ = uStack_90;
  auVar664._8_8_ = 0;
  auVar664._0_8_ = local_e8;
  auVar234._8_8_ = 0;
  auVar234._0_8_ = local_88;
  auVar665._8_8_ = 0;
  auVar665._0_8_ = uStack_f0;
  auVar1094 = auVar233 * auVar664 + auVar983 + auVar234 * auVar665;
  uVar1071 = auVar1094._0_8_;
  auVar235._8_8_ = 0;
  auVar235._0_8_ = uVar1071 & 0xfffffffffffff;
  auVar1089 = auVar230 * auVar661 + auVar982 + auVar231 * auVar662 + auVar232 * auVar663 +
              auVar235 * ZEXT816(0x1000003d10);
  uVar1074 = auVar1089._0_8_;
  uVar1073 = uVar1074 & 0xfffffffffffff;
  auVar984._8_8_ = 0;
  auVar984._0_8_ = (uVar1074 >> 0x34 | auVar1089._8_8_ << 0xc) + (uVar1076 & 0xfffffffffffff);
  auVar236._8_8_ = 0;
  auVar236._0_8_ = uVar1071 >> 0x34 | auVar1094._8_8_ << 0xc;
  auVar984 = auVar236 * ZEXT816(0x1000003d10) + auVar984;
  uVar1071 = auVar984._0_8_;
  uVar1076 = uVar1071 & 0xfffffffffffff;
  uVar1075 = (uVar1071 >> 0x34 | auVar984._8_8_ << 0xc) + (uVar1079 & 0xffffffffffff);
  auVar237._8_8_ = 0;
  auVar237._0_8_ = local_160.n[0];
  auVar666._8_8_ = 0;
  auVar666._0_8_ = uVar1076;
  auVar238._8_8_ = 0;
  auVar238._0_8_ = local_160.n[1];
  auVar667._8_8_ = 0;
  auVar667._0_8_ = uVar1073;
  auVar239._8_8_ = 0;
  auVar239._0_8_ = local_160.n[2];
  auVar668._8_8_ = 0;
  auVar668._0_8_ = uVar1072;
  auVar240._8_8_ = 0;
  auVar240._0_8_ = local_160.n[3];
  auVar669._8_8_ = 0;
  auVar669._0_8_ = uVar1070;
  auVar241._8_8_ = 0;
  auVar241._0_8_ = local_160.n[4];
  auVar670._8_8_ = 0;
  auVar670._0_8_ = uVar1075;
  uVar1079 = SUB168(auVar241 * auVar670,0);
  auVar242._8_8_ = 0;
  auVar242._0_8_ = uVar1079 & 0xfffffffffffff;
  auVar1089 = auVar238 * auVar667 + auVar237 * auVar666 + auVar239 * auVar668 + auVar240 * auVar669
              + auVar242 * ZEXT816(0x1000003d10);
  uVar1071 = auVar1089._0_8_;
  auVar985._8_8_ = 0;
  auVar985._0_8_ = uVar1071 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar243._8_8_ = 0;
  auVar243._0_8_ = local_160.n[0];
  auVar671._8_8_ = 0;
  auVar671._0_8_ = uVar1075;
  auVar244._8_8_ = 0;
  auVar244._0_8_ = local_160.n[1];
  auVar672._8_8_ = 0;
  auVar672._0_8_ = uVar1076;
  auVar245._8_8_ = 0;
  auVar245._0_8_ = local_160.n[2];
  auVar673._8_8_ = 0;
  auVar673._0_8_ = uVar1073;
  auVar246._8_8_ = 0;
  auVar246._0_8_ = local_160.n[3];
  auVar674._8_8_ = 0;
  auVar674._0_8_ = uVar1072;
  auVar247._8_8_ = 0;
  auVar247._0_8_ = local_160.n[4];
  auVar675._8_8_ = 0;
  auVar675._0_8_ = uVar1070;
  auVar248._8_8_ = 0;
  auVar248._0_8_ = uVar1079 >> 0x34 | SUB168(auVar241 * auVar670,8) << 0xc;
  auVar1089 = auVar243 * auVar671 + auVar985 + auVar244 * auVar672 + auVar245 * auVar673 +
              auVar246 * auVar674 + auVar247 * auVar675 + auVar248 * ZEXT816(0x1000003d10);
  uVar1079 = auVar1089._0_8_;
  auVar986._8_8_ = 0;
  auVar986._0_8_ = uVar1079 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar249._8_8_ = 0;
  auVar249._0_8_ = local_160.n[0];
  auVar676._8_8_ = 0;
  auVar676._0_8_ = uVar1070;
  auVar250._8_8_ = 0;
  auVar250._0_8_ = local_160.n[1];
  auVar677._8_8_ = 0;
  auVar677._0_8_ = uVar1075;
  auVar251._8_8_ = 0;
  auVar251._0_8_ = local_160.n[2];
  auVar678._8_8_ = 0;
  auVar678._0_8_ = uVar1076;
  auVar252._8_8_ = 0;
  auVar252._0_8_ = local_160.n[3];
  auVar679._8_8_ = 0;
  auVar679._0_8_ = uVar1073;
  auVar253._8_8_ = 0;
  auVar253._0_8_ = local_160.n[4];
  auVar680._8_8_ = 0;
  auVar680._0_8_ = uVar1072;
  auVar1089 = auVar250 * auVar677 + auVar986 + auVar251 * auVar678 + auVar252 * auVar679 +
              auVar253 * auVar680;
  uVar1074 = auVar1089._0_8_;
  auVar988._8_8_ = 0;
  auVar988._0_8_ = uVar1074 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar681._8_8_ = 0;
  auVar681._0_8_ = (uVar1074 & 0xfffffffffffff) << 4 | (uVar1079 & 0xfffffffffffff) >> 0x30;
  auVar1089 = auVar249 * auVar676 + ZEXT816(0x1000003d1) * auVar681;
  uVar1074 = auVar1089._0_8_;
  local_238._0_8_ = uVar1074 & 0xfffffffffffff;
  auVar987._8_8_ = 0;
  auVar987._0_8_ = uVar1074 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar254._8_8_ = 0;
  auVar254._0_8_ = local_160.n[0];
  auVar682._8_8_ = 0;
  auVar682._0_8_ = uVar1072;
  auVar255._8_8_ = 0;
  auVar255._0_8_ = local_160.n[1];
  auVar683._8_8_ = 0;
  auVar683._0_8_ = uVar1070;
  auVar256._8_8_ = 0;
  auVar256._0_8_ = local_160.n[2];
  auVar684._8_8_ = 0;
  auVar684._0_8_ = uVar1075;
  auVar257._8_8_ = 0;
  auVar257._0_8_ = local_160.n[3];
  auVar685._8_8_ = 0;
  auVar685._0_8_ = uVar1076;
  auVar258._8_8_ = 0;
  auVar258._0_8_ = local_160.n[4];
  auVar686._8_8_ = 0;
  auVar686._0_8_ = uVar1073;
  auVar1094 = auVar256 * auVar684 + auVar988 + auVar257 * auVar685 + auVar258 * auVar686;
  uVar1074 = auVar1094._0_8_;
  auVar259._8_8_ = 0;
  auVar259._0_8_ = uVar1074 & 0xfffffffffffff;
  auVar1089 = auVar254 * auVar682 + auVar987 + auVar255 * auVar683 +
              auVar259 * ZEXT816(0x1000003d10);
  uVar1077 = auVar1089._0_8_;
  auVar990._8_8_ = 0;
  auVar990._0_8_ = uVar1074 >> 0x34 | auVar1094._8_8_ << 0xc;
  local_238._8_8_ = uVar1077 & 0xfffffffffffff;
  auVar989._8_8_ = 0;
  auVar989._0_8_ = uVar1077 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar260._8_8_ = 0;
  auVar260._0_8_ = local_160.n[0];
  auVar687._8_8_ = 0;
  auVar687._0_8_ = uVar1073;
  auVar261._8_8_ = 0;
  auVar261._0_8_ = local_160.n[1];
  auVar688._8_8_ = 0;
  auVar688._0_8_ = uVar1072;
  auVar262._8_8_ = 0;
  auVar262._0_8_ = local_160.n[2];
  auVar689._8_8_ = 0;
  auVar689._0_8_ = uVar1070;
  auVar263._8_8_ = 0;
  auVar263._0_8_ = local_160.n[3];
  auVar690._8_8_ = 0;
  auVar690._0_8_ = uVar1075;
  auVar264._8_8_ = 0;
  auVar264._0_8_ = local_160.n[4];
  auVar691._8_8_ = 0;
  auVar691._0_8_ = uVar1076;
  auVar1094 = auVar263 * auVar690 + auVar990 + auVar264 * auVar691;
  uVar1070 = auVar1094._0_8_;
  auVar265._8_8_ = 0;
  auVar265._0_8_ = uVar1070 & 0xfffffffffffff;
  auVar1089 = auVar260 * auVar687 + auVar989 + auVar261 * auVar688 + auVar262 * auVar689 +
              auVar265 * ZEXT816(0x1000003d10);
  uVar1072 = auVar1089._0_8_;
  local_228._0_8_ = uVar1072 & 0xfffffffffffff;
  auVar991._8_8_ = 0;
  auVar991._0_8_ = (uVar1072 >> 0x34 | auVar1089._8_8_ << 0xc) + (uVar1071 & 0xfffffffffffff);
  auVar266._8_8_ = 0;
  auVar266._0_8_ = uVar1070 >> 0x34 | auVar1094._8_8_ << 0xc;
  auVar991 = auVar266 * ZEXT816(0x1000003d10) + auVar991;
  uVar1070 = auVar991._0_8_;
  local_228._8_8_ = uVar1070 & 0xfffffffffffff;
  local_218 = (uVar1070 >> 0x34 | auVar991._8_8_ << 0xc) + (uVar1079 & 0xffffffffffff);
  auVar267._8_8_ = 0;
  auVar267._0_8_ = local_a8;
  auVar692._8_8_ = 0;
  auVar692._0_8_ = uStack_170;
  auVar268._8_8_ = 0;
  auVar268._0_8_ = uStack_a0;
  auVar693._8_8_ = 0;
  auVar693._0_8_ = local_178;
  auVar269._8_8_ = 0;
  auVar269._0_8_ = local_98;
  auVar694._8_8_ = 0;
  auVar694._0_8_ = uStack_180;
  auVar270._8_8_ = 0;
  auVar270._0_8_ = uStack_90;
  auVar695._8_8_ = 0;
  auVar695._0_8_ = local_188;
  auVar271._8_8_ = 0;
  auVar271._0_8_ = local_88;
  auVar696._8_8_ = 0;
  auVar696._0_8_ = local_168;
  uVar1070 = SUB168(auVar271 * auVar696,0);
  auVar272._8_8_ = 0;
  auVar272._0_8_ = uVar1070 & 0xfffffffffffff;
  auVar1089 = auVar268 * auVar693 + auVar267 * auVar692 + auVar269 * auVar694 + auVar270 * auVar695
              + auVar272 * ZEXT816(0x1000003d10);
  uVar1076 = auVar1089._0_8_;
  auVar992._8_8_ = 0;
  auVar992._0_8_ = uVar1076 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = local_a8;
  auVar697._8_8_ = 0;
  auVar697._0_8_ = local_168;
  auVar274._8_8_ = 0;
  auVar274._0_8_ = uStack_a0;
  auVar698._8_8_ = 0;
  auVar698._0_8_ = uStack_170;
  auVar275._8_8_ = 0;
  auVar275._0_8_ = local_98;
  auVar699._8_8_ = 0;
  auVar699._0_8_ = local_178;
  auVar276._8_8_ = 0;
  auVar276._0_8_ = uStack_90;
  auVar700._8_8_ = 0;
  auVar700._0_8_ = uStack_180;
  auVar277._8_8_ = 0;
  auVar277._0_8_ = local_88;
  auVar701._8_8_ = 0;
  auVar701._0_8_ = local_188;
  auVar278._8_8_ = 0;
  auVar278._0_8_ = uVar1070 >> 0x34 | SUB168(auVar271 * auVar696,8) << 0xc;
  auVar1089 = auVar273 * auVar697 + auVar992 + auVar274 * auVar698 + auVar275 * auVar699 +
              auVar276 * auVar700 + auVar277 * auVar701 + auVar278 * ZEXT816(0x1000003d10);
  uVar1079 = auVar1089._0_8_;
  auVar993._8_8_ = 0;
  auVar993._0_8_ = uVar1079 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar279._8_8_ = 0;
  auVar279._0_8_ = local_a8;
  auVar702._8_8_ = 0;
  auVar702._0_8_ = local_188;
  auVar280._8_8_ = 0;
  auVar280._0_8_ = uStack_a0;
  auVar703._8_8_ = 0;
  auVar703._0_8_ = local_168;
  auVar281._8_8_ = 0;
  auVar281._0_8_ = local_98;
  auVar704._8_8_ = 0;
  auVar704._0_8_ = uStack_170;
  auVar282._8_8_ = 0;
  auVar282._0_8_ = uStack_90;
  auVar705._8_8_ = 0;
  auVar705._0_8_ = local_178;
  auVar283._8_8_ = 0;
  auVar283._0_8_ = local_88;
  auVar706._8_8_ = 0;
  auVar706._0_8_ = uStack_180;
  auVar1089 = auVar280 * auVar703 + auVar993 + auVar281 * auVar704 + auVar282 * auVar705 +
              auVar283 * auVar706;
  uVar1070 = auVar1089._0_8_;
  auVar995._8_8_ = 0;
  auVar995._0_8_ = uVar1070 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar707._8_8_ = 0;
  auVar707._0_8_ = (uVar1070 & 0xfffffffffffff) << 4 | (uVar1079 & 0xfffffffffffff) >> 0x30;
  auVar1089 = auVar279 * auVar702 + ZEXT816(0x1000003d1) * auVar707;
  uVar1072 = auVar1089._0_8_;
  uVar1070 = uVar1072 & 0xfffffffffffff;
  auVar994._8_8_ = 0;
  auVar994._0_8_ = uVar1072 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar284._8_8_ = 0;
  auVar284._0_8_ = local_a8;
  auVar708._8_8_ = 0;
  auVar708._0_8_ = uStack_180;
  auVar285._8_8_ = 0;
  auVar285._0_8_ = uStack_a0;
  auVar709._8_8_ = 0;
  auVar709._0_8_ = local_188;
  auVar286._8_8_ = 0;
  auVar286._0_8_ = local_98;
  auVar710._8_8_ = 0;
  auVar710._0_8_ = local_168;
  auVar287._8_8_ = 0;
  auVar287._0_8_ = uStack_90;
  auVar711._8_8_ = 0;
  auVar711._0_8_ = uStack_170;
  auVar288._8_8_ = 0;
  auVar288._0_8_ = local_88;
  auVar712._8_8_ = 0;
  auVar712._0_8_ = local_178;
  auVar1094 = auVar286 * auVar710 + auVar995 + auVar287 * auVar711 + auVar288 * auVar712;
  uVar1072 = auVar1094._0_8_;
  auVar289._8_8_ = 0;
  auVar289._0_8_ = uVar1072 & 0xfffffffffffff;
  auVar1089 = auVar284 * auVar708 + auVar994 + auVar285 * auVar709 +
              auVar289 * ZEXT816(0x1000003d10);
  uVar1073 = auVar1089._0_8_;
  auVar997._8_8_ = 0;
  auVar997._0_8_ = uVar1072 >> 0x34 | auVar1094._8_8_ << 0xc;
  uVar1072 = uVar1073 & 0xfffffffffffff;
  auVar996._8_8_ = 0;
  auVar996._0_8_ = uVar1073 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar290._8_8_ = 0;
  auVar290._0_8_ = local_a8;
  auVar713._8_8_ = 0;
  auVar713._0_8_ = local_178;
  auVar291._8_8_ = 0;
  auVar291._0_8_ = uStack_a0;
  auVar714._8_8_ = 0;
  auVar714._0_8_ = uStack_180;
  auVar292._8_8_ = 0;
  auVar292._0_8_ = local_98;
  auVar715._8_8_ = 0;
  auVar715._0_8_ = local_188;
  auVar293._8_8_ = 0;
  auVar293._0_8_ = uStack_90;
  auVar716._8_8_ = 0;
  auVar716._0_8_ = local_168;
  auVar294._8_8_ = 0;
  auVar294._0_8_ = local_88;
  auVar717._8_8_ = 0;
  auVar717._0_8_ = uStack_170;
  auVar1094 = auVar293 * auVar716 + auVar997 + auVar294 * auVar717;
  uVar1071 = auVar1094._0_8_;
  auVar295._8_8_ = 0;
  auVar295._0_8_ = uVar1071 & 0xfffffffffffff;
  auVar1089 = auVar290 * auVar713 + auVar996 + auVar291 * auVar714 + auVar292 * auVar715 +
              auVar295 * ZEXT816(0x1000003d10);
  uVar1074 = auVar1089._0_8_;
  uVar1073 = uVar1074 & 0xfffffffffffff;
  auVar998._8_8_ = 0;
  auVar998._0_8_ = (uVar1074 >> 0x34 | auVar1089._8_8_ << 0xc) + (uVar1076 & 0xfffffffffffff);
  auVar296._8_8_ = 0;
  auVar296._0_8_ = uVar1071 >> 0x34 | auVar1094._8_8_ << 0xc;
  auVar998 = auVar296 * ZEXT816(0x1000003d10) + auVar998;
  uVar1071 = auVar998._0_8_;
  uVar1076 = uVar1071 & 0xfffffffffffff;
  uVar1075 = (uVar1071 >> 0x34 | auVar998._8_8_ << 0xc) + (uVar1079 & 0xffffffffffff);
  auVar297._8_8_ = 0;
  auVar297._0_8_ = local_160.n[0];
  auVar718._8_8_ = 0;
  auVar718._0_8_ = uVar1076;
  auVar298._8_8_ = 0;
  auVar298._0_8_ = local_160.n[1];
  auVar719._8_8_ = 0;
  auVar719._0_8_ = uVar1073;
  auVar299._8_8_ = 0;
  auVar299._0_8_ = local_160.n[2];
  auVar720._8_8_ = 0;
  auVar720._0_8_ = uVar1072;
  auVar300._8_8_ = 0;
  auVar300._0_8_ = local_160.n[3];
  auVar721._8_8_ = 0;
  auVar721._0_8_ = uVar1070;
  auVar301._8_8_ = 0;
  auVar301._0_8_ = local_160.n[4];
  auVar722._8_8_ = 0;
  auVar722._0_8_ = uVar1075;
  uVar1079 = SUB168(auVar301 * auVar722,0);
  auVar302._8_8_ = 0;
  auVar302._0_8_ = uVar1079 & 0xfffffffffffff;
  auVar1089 = auVar298 * auVar719 + auVar297 * auVar718 + auVar299 * auVar720 + auVar300 * auVar721
              + auVar302 * ZEXT816(0x1000003d10);
  uVar1071 = auVar1089._0_8_;
  auVar999._8_8_ = 0;
  auVar999._0_8_ = uVar1071 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar303._8_8_ = 0;
  auVar303._0_8_ = local_160.n[0];
  auVar723._8_8_ = 0;
  auVar723._0_8_ = uVar1075;
  auVar304._8_8_ = 0;
  auVar304._0_8_ = local_160.n[1];
  auVar724._8_8_ = 0;
  auVar724._0_8_ = uVar1076;
  auVar305._8_8_ = 0;
  auVar305._0_8_ = local_160.n[2];
  auVar725._8_8_ = 0;
  auVar725._0_8_ = uVar1073;
  auVar306._8_8_ = 0;
  auVar306._0_8_ = local_160.n[3];
  auVar726._8_8_ = 0;
  auVar726._0_8_ = uVar1072;
  auVar307._8_8_ = 0;
  auVar307._0_8_ = local_160.n[4];
  auVar727._8_8_ = 0;
  auVar727._0_8_ = uVar1070;
  auVar308._8_8_ = 0;
  auVar308._0_8_ = uVar1079 >> 0x34 | SUB168(auVar301 * auVar722,8) << 0xc;
  auVar1089 = auVar303 * auVar723 + auVar999 + auVar304 * auVar724 + auVar305 * auVar725 +
              auVar306 * auVar726 + auVar307 * auVar727 + auVar308 * ZEXT816(0x1000003d10);
  uVar1079 = auVar1089._0_8_;
  auVar1000._8_8_ = 0;
  auVar1000._0_8_ = uVar1079 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar309._8_8_ = 0;
  auVar309._0_8_ = local_160.n[0];
  auVar728._8_8_ = 0;
  auVar728._0_8_ = uVar1070;
  auVar310._8_8_ = 0;
  auVar310._0_8_ = local_160.n[1];
  auVar729._8_8_ = 0;
  auVar729._0_8_ = uVar1075;
  auVar311._8_8_ = 0;
  auVar311._0_8_ = local_160.n[2];
  auVar730._8_8_ = 0;
  auVar730._0_8_ = uVar1076;
  auVar312._8_8_ = 0;
  auVar312._0_8_ = local_160.n[3];
  auVar731._8_8_ = 0;
  auVar731._0_8_ = uVar1073;
  auVar313._8_8_ = 0;
  auVar313._0_8_ = local_160.n[4];
  auVar732._8_8_ = 0;
  auVar732._0_8_ = uVar1072;
  auVar1089 = auVar310 * auVar729 + auVar1000 + auVar311 * auVar730 + auVar312 * auVar731 +
              auVar313 * auVar732;
  uVar1074 = auVar1089._0_8_;
  auVar1002._8_8_ = 0;
  auVar1002._0_8_ = uVar1074 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar733._8_8_ = 0;
  auVar733._0_8_ = (uVar1074 & 0xfffffffffffff) << 4 | (uVar1079 & 0xfffffffffffff) >> 0x30;
  auVar1089 = auVar309 * auVar728 + ZEXT816(0x1000003d1) * auVar733;
  uVar1074 = auVar1089._0_8_;
  local_268 = uVar1074 & 0xfffffffffffff;
  auVar1001._8_8_ = 0;
  auVar1001._0_8_ = uVar1074 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar314._8_8_ = 0;
  auVar314._0_8_ = local_160.n[0];
  auVar734._8_8_ = 0;
  auVar734._0_8_ = uVar1072;
  auVar315._8_8_ = 0;
  auVar315._0_8_ = local_160.n[1];
  auVar735._8_8_ = 0;
  auVar735._0_8_ = uVar1070;
  auVar316._8_8_ = 0;
  auVar316._0_8_ = local_160.n[2];
  auVar736._8_8_ = 0;
  auVar736._0_8_ = uVar1075;
  auVar317._8_8_ = 0;
  auVar317._0_8_ = local_160.n[3];
  auVar737._8_8_ = 0;
  auVar737._0_8_ = uVar1076;
  auVar318._8_8_ = 0;
  auVar318._0_8_ = local_160.n[4];
  auVar738._8_8_ = 0;
  auVar738._0_8_ = uVar1073;
  auVar1094 = auVar316 * auVar736 + auVar1002 + auVar317 * auVar737 + auVar318 * auVar738;
  uVar1074 = auVar1094._0_8_;
  auVar319._8_8_ = 0;
  auVar319._0_8_ = uVar1074 & 0xfffffffffffff;
  auVar1089 = auVar314 * auVar734 + auVar1001 + auVar315 * auVar735 +
              auVar319 * ZEXT816(0x1000003d10);
  uVar1077 = auVar1089._0_8_;
  auVar1004._8_8_ = 0;
  auVar1004._0_8_ = uVar1074 >> 0x34 | auVar1094._8_8_ << 0xc;
  uStack_260 = uVar1077 & 0xfffffffffffff;
  auVar1003._8_8_ = 0;
  auVar1003._0_8_ = uVar1077 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar320._8_8_ = 0;
  auVar320._0_8_ = local_160.n[0];
  auVar739._8_8_ = 0;
  auVar739._0_8_ = uVar1073;
  auVar321._8_8_ = 0;
  auVar321._0_8_ = local_160.n[1];
  auVar740._8_8_ = 0;
  auVar740._0_8_ = uVar1072;
  auVar322._8_8_ = 0;
  auVar322._0_8_ = local_160.n[2];
  auVar741._8_8_ = 0;
  auVar741._0_8_ = uVar1070;
  auVar323._8_8_ = 0;
  auVar323._0_8_ = local_160.n[3];
  auVar742._8_8_ = 0;
  auVar742._0_8_ = uVar1075;
  auVar324._8_8_ = 0;
  auVar324._0_8_ = local_160.n[4];
  auVar743._8_8_ = 0;
  auVar743._0_8_ = uVar1076;
  auVar1094 = auVar323 * auVar742 + auVar1004 + auVar324 * auVar743;
  uVar1070 = auVar1094._0_8_;
  auVar325._8_8_ = 0;
  auVar325._0_8_ = uVar1070 & 0xfffffffffffff;
  auVar1089 = auVar320 * auVar739 + auVar1003 + auVar321 * auVar740 + auVar322 * auVar741 +
              auVar325 * ZEXT816(0x1000003d10);
  uVar1072 = auVar1089._0_8_;
  local_258 = uVar1072 & 0xfffffffffffff;
  auVar1005._8_8_ = 0;
  auVar1005._0_8_ = (uVar1072 >> 0x34 | auVar1089._8_8_ << 0xc) + (uVar1071 & 0xfffffffffffff);
  auVar326._8_8_ = 0;
  auVar326._0_8_ = uVar1070 >> 0x34 | auVar1094._8_8_ << 0xc;
  auVar1005 = auVar326 * ZEXT816(0x1000003d10) + auVar1005;
  uVar1070 = auVar1005._0_8_;
  uStack_250 = uVar1070 & 0xfffffffffffff;
  local_248 = (uVar1070 >> 0x34 | auVar1005._8_8_ << 0xc) + (uVar1079 & 0xffffffffffff);
  auVar327._8_8_ = 0;
  auVar327._0_8_ = local_1d8;
  auVar744._8_8_ = 0;
  auVar744._0_8_ = uStack_1f0;
  auVar328._8_8_ = 0;
  auVar328._0_8_ = uStack_1d0;
  auVar745._8_8_ = 0;
  auVar745._0_8_ = local_1f8;
  auVar329._8_8_ = 0;
  auVar329._0_8_ = local_1c8;
  auVar746._8_8_ = 0;
  auVar746._0_8_ = uStack_200;
  auVar330._8_8_ = 0;
  auVar330._0_8_ = uStack_1c0;
  auVar747._8_8_ = 0;
  auVar747._0_8_ = local_208;
  auVar331._8_8_ = 0;
  auVar331._0_8_ = local_1b8;
  auVar748._8_8_ = 0;
  auVar748._0_8_ = local_1e8;
  uVar1070 = SUB168(auVar331 * auVar748,0);
  auVar332._8_8_ = 0;
  auVar332._0_8_ = uVar1070 & 0xfffffffffffff;
  auVar1089 = auVar328 * auVar745 + auVar327 * auVar744 + auVar329 * auVar746 + auVar330 * auVar747
              + auVar332 * ZEXT816(0x1000003d10);
  uVar1076 = auVar1089._0_8_;
  auVar1006._8_8_ = 0;
  auVar1006._0_8_ = uVar1076 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar333._8_8_ = 0;
  auVar333._0_8_ = local_1d8;
  auVar749._8_8_ = 0;
  auVar749._0_8_ = local_1e8;
  auVar334._8_8_ = 0;
  auVar334._0_8_ = uStack_1d0;
  auVar750._8_8_ = 0;
  auVar750._0_8_ = uStack_1f0;
  auVar335._8_8_ = 0;
  auVar335._0_8_ = local_1c8;
  auVar751._8_8_ = 0;
  auVar751._0_8_ = local_1f8;
  auVar336._8_8_ = 0;
  auVar336._0_8_ = uStack_1c0;
  auVar752._8_8_ = 0;
  auVar752._0_8_ = uStack_200;
  auVar337._8_8_ = 0;
  auVar337._0_8_ = local_1b8;
  auVar753._8_8_ = 0;
  auVar753._0_8_ = local_208;
  auVar338._8_8_ = 0;
  auVar338._0_8_ = uVar1070 >> 0x34 | SUB168(auVar331 * auVar748,8) << 0xc;
  auVar1089 = auVar333 * auVar749 + auVar1006 + auVar334 * auVar750 + auVar335 * auVar751 +
              auVar336 * auVar752 + auVar337 * auVar753 + auVar338 * ZEXT816(0x1000003d10);
  uVar1079 = auVar1089._0_8_;
  auVar1007._8_8_ = 0;
  auVar1007._0_8_ = uVar1079 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar339._8_8_ = 0;
  auVar339._0_8_ = local_1d8;
  auVar754._8_8_ = 0;
  auVar754._0_8_ = local_208;
  auVar340._8_8_ = 0;
  auVar340._0_8_ = uStack_1d0;
  auVar755._8_8_ = 0;
  auVar755._0_8_ = local_1e8;
  auVar341._8_8_ = 0;
  auVar341._0_8_ = local_1c8;
  auVar756._8_8_ = 0;
  auVar756._0_8_ = uStack_1f0;
  auVar342._8_8_ = 0;
  auVar342._0_8_ = uStack_1c0;
  auVar757._8_8_ = 0;
  auVar757._0_8_ = local_1f8;
  auVar343._8_8_ = 0;
  auVar343._0_8_ = local_1b8;
  auVar758._8_8_ = 0;
  auVar758._0_8_ = uStack_200;
  auVar1089 = auVar340 * auVar755 + auVar1007 + auVar341 * auVar756 + auVar342 * auVar757 +
              auVar343 * auVar758;
  uVar1070 = auVar1089._0_8_;
  auVar1009._8_8_ = 0;
  auVar1009._0_8_ = uVar1070 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar759._8_8_ = 0;
  auVar759._0_8_ = (uVar1070 & 0xfffffffffffff) << 4 | (uVar1079 & 0xfffffffffffff) >> 0x30;
  auVar1089 = auVar339 * auVar754 + ZEXT816(0x1000003d1) * auVar759;
  uVar1072 = auVar1089._0_8_;
  uVar1070 = uVar1072 & 0xfffffffffffff;
  auVar1008._8_8_ = 0;
  auVar1008._0_8_ = uVar1072 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar344._8_8_ = 0;
  auVar344._0_8_ = local_1d8;
  auVar760._8_8_ = 0;
  auVar760._0_8_ = uStack_200;
  auVar345._8_8_ = 0;
  auVar345._0_8_ = uStack_1d0;
  auVar761._8_8_ = 0;
  auVar761._0_8_ = local_208;
  auVar346._8_8_ = 0;
  auVar346._0_8_ = local_1c8;
  auVar762._8_8_ = 0;
  auVar762._0_8_ = local_1e8;
  auVar347._8_8_ = 0;
  auVar347._0_8_ = uStack_1c0;
  auVar763._8_8_ = 0;
  auVar763._0_8_ = uStack_1f0;
  auVar348._8_8_ = 0;
  auVar348._0_8_ = local_1b8;
  auVar764._8_8_ = 0;
  auVar764._0_8_ = local_1f8;
  auVar1094 = auVar346 * auVar762 + auVar1009 + auVar347 * auVar763 + auVar348 * auVar764;
  uVar1072 = auVar1094._0_8_;
  auVar349._8_8_ = 0;
  auVar349._0_8_ = uVar1072 & 0xfffffffffffff;
  auVar1089 = auVar344 * auVar760 + auVar1008 + auVar345 * auVar761 +
              auVar349 * ZEXT816(0x1000003d10);
  uVar1073 = auVar1089._0_8_;
  auVar1011._8_8_ = 0;
  auVar1011._0_8_ = uVar1072 >> 0x34 | auVar1094._8_8_ << 0xc;
  uVar1072 = uVar1073 & 0xfffffffffffff;
  auVar1010._8_8_ = 0;
  auVar1010._0_8_ = uVar1073 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar350._8_8_ = 0;
  auVar350._0_8_ = local_1d8;
  auVar765._8_8_ = 0;
  auVar765._0_8_ = local_1f8;
  auVar351._8_8_ = 0;
  auVar351._0_8_ = uStack_1d0;
  auVar766._8_8_ = 0;
  auVar766._0_8_ = uStack_200;
  auVar352._8_8_ = 0;
  auVar352._0_8_ = local_1c8;
  auVar767._8_8_ = 0;
  auVar767._0_8_ = local_208;
  auVar353._8_8_ = 0;
  auVar353._0_8_ = uStack_1c0;
  auVar768._8_8_ = 0;
  auVar768._0_8_ = local_1e8;
  auVar354._8_8_ = 0;
  auVar354._0_8_ = local_1b8;
  auVar769._8_8_ = 0;
  auVar769._0_8_ = uStack_1f0;
  auVar1094 = auVar353 * auVar768 + auVar1011 + auVar354 * auVar769;
  uVar1071 = auVar1094._0_8_;
  auVar355._8_8_ = 0;
  auVar355._0_8_ = uVar1071 & 0xfffffffffffff;
  auVar1089 = auVar350 * auVar765 + auVar1010 + auVar351 * auVar766 + auVar352 * auVar767 +
              auVar355 * ZEXT816(0x1000003d10);
  uVar1074 = auVar1089._0_8_;
  uVar1073 = uVar1074 & 0xfffffffffffff;
  auVar1012._8_8_ = 0;
  auVar1012._0_8_ = (uVar1074 >> 0x34 | auVar1089._8_8_ << 0xc) + (uVar1076 & 0xfffffffffffff);
  auVar356._8_8_ = 0;
  auVar356._0_8_ = uVar1071 >> 0x34 | auVar1094._8_8_ << 0xc;
  auVar1012 = auVar356 * ZEXT816(0x1000003d10) + auVar1012;
  uVar1071 = auVar1012._0_8_;
  uVar1076 = uVar1071 & 0xfffffffffffff;
  uVar1077 = (uVar1071 >> 0x34 | auVar1012._8_8_ << 0xc) + (uVar1079 & 0xffffffffffff);
  auVar357._8_8_ = 0;
  auVar357._0_8_ = local_160.n[0];
  auVar770._8_8_ = 0;
  auVar770._0_8_ = uVar1076;
  auVar358._8_8_ = 0;
  auVar358._0_8_ = local_160.n[1];
  auVar771._8_8_ = 0;
  auVar771._0_8_ = uVar1073;
  auVar359._8_8_ = 0;
  auVar359._0_8_ = local_160.n[2];
  auVar772._8_8_ = 0;
  auVar772._0_8_ = uVar1072;
  auVar360._8_8_ = 0;
  auVar360._0_8_ = local_160.n[3];
  auVar773._8_8_ = 0;
  auVar773._0_8_ = uVar1070;
  auVar361._8_8_ = 0;
  auVar361._0_8_ = local_160.n[4];
  auVar774._8_8_ = 0;
  auVar774._0_8_ = uVar1077;
  uVar1079 = SUB168(auVar361 * auVar774,0);
  auVar362._8_8_ = 0;
  auVar362._0_8_ = uVar1079 & 0xfffffffffffff;
  auVar1089 = auVar358 * auVar771 + auVar357 * auVar770 + auVar359 * auVar772 + auVar360 * auVar773
              + auVar362 * ZEXT816(0x1000003d10);
  uVar1074 = auVar1089._0_8_;
  auVar1013._8_8_ = 0;
  auVar1013._0_8_ = uVar1074 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar363._8_8_ = 0;
  auVar363._0_8_ = local_160.n[0];
  auVar775._8_8_ = 0;
  auVar775._0_8_ = uVar1077;
  auVar364._8_8_ = 0;
  auVar364._0_8_ = local_160.n[1];
  auVar776._8_8_ = 0;
  auVar776._0_8_ = uVar1076;
  auVar365._8_8_ = 0;
  auVar365._0_8_ = local_160.n[2];
  auVar777._8_8_ = 0;
  auVar777._0_8_ = uVar1073;
  auVar366._8_8_ = 0;
  auVar366._0_8_ = local_160.n[3];
  auVar778._8_8_ = 0;
  auVar778._0_8_ = uVar1072;
  auVar367._8_8_ = 0;
  auVar367._0_8_ = local_160.n[4];
  auVar779._8_8_ = 0;
  auVar779._0_8_ = uVar1070;
  auVar368._8_8_ = 0;
  auVar368._0_8_ = uVar1079 >> 0x34 | SUB168(auVar361 * auVar774,8) << 0xc;
  auVar1089 = auVar363 * auVar775 + auVar1013 + auVar364 * auVar776 + auVar365 * auVar777 +
              auVar366 * auVar778 + auVar367 * auVar779 + auVar368 * ZEXT816(0x1000003d10);
  uVar1075 = auVar1089._0_8_;
  auVar1014._8_8_ = 0;
  auVar1014._0_8_ = uVar1075 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar369._8_8_ = 0;
  auVar369._0_8_ = local_160.n[0];
  auVar780._8_8_ = 0;
  auVar780._0_8_ = uVar1070;
  auVar370._8_8_ = 0;
  auVar370._0_8_ = local_160.n[1];
  auVar781._8_8_ = 0;
  auVar781._0_8_ = uVar1077;
  auVar371._8_8_ = 0;
  auVar371._0_8_ = local_160.n[2];
  auVar782._8_8_ = 0;
  auVar782._0_8_ = uVar1076;
  auVar372._8_8_ = 0;
  auVar372._0_8_ = local_160.n[3];
  auVar783._8_8_ = 0;
  auVar783._0_8_ = uVar1073;
  auVar373._8_8_ = 0;
  auVar373._0_8_ = local_160.n[4];
  auVar784._8_8_ = 0;
  auVar784._0_8_ = uVar1072;
  auVar1089 = auVar370 * auVar781 + auVar1014 + auVar371 * auVar782 + auVar372 * auVar783 +
              auVar373 * auVar784;
  uVar1079 = auVar1089._0_8_;
  auVar1016._8_8_ = 0;
  auVar1016._0_8_ = uVar1079 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar785._8_8_ = 0;
  auVar785._0_8_ = (uVar1079 & 0xfffffffffffff) << 4 | (uVar1075 & 0xfffffffffffff) >> 0x30;
  auVar1089 = auVar369 * auVar780 + ZEXT816(0x1000003d1) * auVar785;
  uVar1071 = auVar1089._0_8_;
  uVar1079 = uVar1071 & 0xfffffffffffff;
  auVar1015._8_8_ = 0;
  auVar1015._0_8_ = uVar1071 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar374._8_8_ = 0;
  auVar374._0_8_ = local_160.n[0];
  auVar786._8_8_ = 0;
  auVar786._0_8_ = uVar1072;
  auVar375._8_8_ = 0;
  auVar375._0_8_ = local_160.n[1];
  auVar787._8_8_ = 0;
  auVar787._0_8_ = uVar1070;
  auVar376._8_8_ = 0;
  auVar376._0_8_ = local_160.n[2];
  auVar788._8_8_ = 0;
  auVar788._0_8_ = uVar1077;
  auVar377._8_8_ = 0;
  auVar377._0_8_ = local_160.n[3];
  auVar789._8_8_ = 0;
  auVar789._0_8_ = uVar1076;
  auVar378._8_8_ = 0;
  auVar378._0_8_ = local_160.n[4];
  auVar790._8_8_ = 0;
  auVar790._0_8_ = uVar1073;
  auVar1094 = auVar376 * auVar788 + auVar1016 + auVar377 * auVar789 + auVar378 * auVar790;
  uVar1071 = auVar1094._0_8_;
  auVar379._8_8_ = 0;
  auVar379._0_8_ = uVar1071 & 0xfffffffffffff;
  auVar1089 = auVar374 * auVar786 + auVar1015 + auVar375 * auVar787 +
              auVar379 * ZEXT816(0x1000003d10);
  uVar1078 = auVar1089._0_8_;
  auVar1018._8_8_ = 0;
  auVar1018._0_8_ = uVar1071 >> 0x34 | auVar1094._8_8_ << 0xc;
  uVar1071 = uVar1078 & 0xfffffffffffff;
  auVar1017._8_8_ = 0;
  auVar1017._0_8_ = uVar1078 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar380._8_8_ = 0;
  auVar380._0_8_ = local_160.n[0];
  auVar791._8_8_ = 0;
  auVar791._0_8_ = uVar1073;
  auVar381._8_8_ = 0;
  auVar381._0_8_ = local_160.n[1];
  auVar792._8_8_ = 0;
  auVar792._0_8_ = uVar1072;
  auVar382._8_8_ = 0;
  auVar382._0_8_ = local_160.n[2];
  auVar793._8_8_ = 0;
  auVar793._0_8_ = uVar1070;
  auVar383._8_8_ = 0;
  auVar383._0_8_ = local_160.n[3];
  auVar794._8_8_ = 0;
  auVar794._0_8_ = uVar1077;
  auVar384._8_8_ = 0;
  auVar384._0_8_ = local_160.n[4];
  auVar795._8_8_ = 0;
  auVar795._0_8_ = uVar1076;
  auVar1094 = auVar383 * auVar794 + auVar1018 + auVar384 * auVar795;
  uVar1070 = auVar1094._0_8_;
  auVar385._8_8_ = 0;
  auVar385._0_8_ = uVar1070 & 0xfffffffffffff;
  auVar1089 = auVar380 * auVar791 + auVar1017 + auVar381 * auVar792 + auVar382 * auVar793 +
              auVar385 * ZEXT816(0x1000003d10);
  uVar1072 = auVar1089._0_8_;
  uVar1073 = uVar1072 & 0xfffffffffffff;
  auVar1019._8_8_ = 0;
  auVar1019._0_8_ = (uVar1072 >> 0x34 | auVar1089._8_8_ << 0xc) + (uVar1074 & 0xfffffffffffff);
  auVar386._8_8_ = 0;
  auVar386._0_8_ = uVar1070 >> 0x34 | auVar1094._8_8_ << 0xc;
  auVar1019 = auVar386 * ZEXT816(0x1000003d10) + auVar1019;
  uVar1070 = auVar1019._0_8_;
  uVar1076 = uVar1070 & 0xfffffffffffff;
  uVar1080 = (uVar1070 >> 0x34 | auVar1019._8_8_ << 0xc) + (uVar1075 & 0xffffffffffff);
  auVar387._8_8_ = 0;
  auVar387._0_8_ = local_238._0_8_ * 2;
  auVar796._8_8_ = 0;
  auVar796._0_8_ = local_228._8_8_;
  auVar388._8_8_ = 0;
  auVar388._0_8_ = local_238._8_8_ * 2;
  auVar797._8_8_ = 0;
  auVar797._0_8_ = local_228._0_8_;
  auVar389._8_8_ = 0;
  auVar389._0_8_ = local_218;
  auVar798._8_8_ = 0;
  auVar798._0_8_ = local_218;
  uVar1072 = SUB168(auVar389 * auVar798,0);
  auVar390._8_8_ = 0;
  auVar390._0_8_ = uVar1072 & 0xfffffffffffff;
  auVar1089 = auVar388 * auVar797 + auVar387 * auVar796 + auVar390 * ZEXT816(0x1000003d10);
  uVar1075 = auVar1089._0_8_;
  auVar1020._8_8_ = 0;
  auVar1020._0_8_ = uVar1075 >> 0x34 | auVar1089._8_8_ << 0xc;
  uVar1070 = local_218 * 2;
  auVar391._8_8_ = 0;
  auVar391._0_8_ = local_238._0_8_;
  auVar799._8_8_ = 0;
  auVar799._0_8_ = uVar1070;
  auVar392._8_8_ = 0;
  auVar392._0_8_ = local_238._8_8_ * 2;
  auVar800._8_8_ = 0;
  auVar800._0_8_ = local_228._8_8_;
  auVar393._8_8_ = 0;
  auVar393._0_8_ = local_228._0_8_;
  auVar801._8_8_ = 0;
  auVar801._0_8_ = local_228._0_8_;
  auVar394._8_8_ = 0;
  auVar394._0_8_ = uVar1072 >> 0x34 | SUB168(auVar389 * auVar798,8) << 0xc;
  auVar1089 = auVar391 * auVar799 + auVar1020 + auVar392 * auVar800 + auVar393 * auVar801 +
              auVar394 * ZEXT816(0x1000003d10);
  uVar1077 = auVar1089._0_8_;
  auVar1021._8_8_ = 0;
  auVar1021._0_8_ = uVar1077 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar395._8_8_ = 0;
  auVar395._0_8_ = local_238._0_8_;
  auVar802._8_8_ = 0;
  auVar802._0_8_ = local_238._0_8_;
  auVar396._8_8_ = 0;
  auVar396._0_8_ = local_238._8_8_;
  auVar803._8_8_ = 0;
  auVar803._0_8_ = uVar1070;
  auVar397._8_8_ = 0;
  auVar397._0_8_ = local_228._0_8_ * 2;
  auVar804._8_8_ = 0;
  auVar804._0_8_ = local_228._8_8_;
  auVar1089 = auVar396 * auVar803 + auVar1021 + auVar397 * auVar804;
  uVar1072 = auVar1089._0_8_;
  auVar1023._8_8_ = 0;
  auVar1023._0_8_ = uVar1072 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar805._8_8_ = 0;
  auVar805._0_8_ = (uVar1072 & 0xfffffffffffff) << 4 | (uVar1077 & 0xfffffffffffff) >> 0x30;
  auVar1089 = auVar395 * auVar802 + ZEXT816(0x1000003d1) * auVar805;
  uVar1074 = auVar1089._0_8_;
  uVar1072 = uVar1074 & 0xfffffffffffff;
  auVar1022._8_8_ = 0;
  auVar1022._0_8_ = uVar1074 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar398._8_8_ = 0;
  auVar398._0_8_ = local_238._0_8_ * 2;
  auVar806._8_8_ = 0;
  auVar806._0_8_ = local_238._8_8_;
  auVar399._8_8_ = 0;
  auVar399._0_8_ = local_228._0_8_;
  auVar807._8_8_ = 0;
  auVar807._0_8_ = uVar1070;
  auVar400._8_8_ = 0;
  auVar400._0_8_ = local_228._8_8_;
  auVar808._8_8_ = 0;
  auVar808._0_8_ = local_228._8_8_;
  auVar1094 = auVar399 * auVar807 + auVar1023 + auVar400 * auVar808;
  uVar1074 = auVar1094._0_8_;
  auVar401._8_8_ = 0;
  auVar401._0_8_ = uVar1074 & 0xfffffffffffff;
  auVar1089 = auVar398 * auVar806 + auVar1022 + auVar401 * ZEXT816(0x1000003d10);
  uVar1078 = auVar1089._0_8_;
  auVar1025._8_8_ = 0;
  auVar1025._0_8_ = uVar1074 >> 0x34 | auVar1094._8_8_ << 0xc;
  uVar1074 = uVar1078 & 0xfffffffffffff;
  auVar1024._8_8_ = 0;
  auVar1024._0_8_ = uVar1078 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar402._8_8_ = 0;
  auVar402._0_8_ = local_238._0_8_ * 2;
  auVar809._8_8_ = 0;
  auVar809._0_8_ = local_228._0_8_;
  auVar403._8_8_ = 0;
  auVar403._0_8_ = local_238._8_8_;
  auVar810._8_8_ = 0;
  auVar810._0_8_ = local_238._8_8_;
  auVar404._8_8_ = 0;
  auVar404._0_8_ = local_228._8_8_;
  auVar811._8_8_ = 0;
  auVar811._0_8_ = uVar1070;
  auVar1025 = auVar404 * auVar811 + auVar1025;
  uVar1078 = auVar1025._0_8_;
  auVar405._8_8_ = 0;
  auVar405._0_8_ = uVar1078 & 0xfffffffffffff;
  auVar1089 = auVar402 * auVar809 + auVar1024 + auVar403 * auVar810 +
              auVar405 * ZEXT816(0x1000003d10);
  uVar1081 = auVar1089._0_8_;
  uVar1070 = uVar1081 & 0xfffffffffffff;
  auVar1026._8_8_ = 0;
  auVar1026._0_8_ = (uVar1081 >> 0x34 | auVar1089._8_8_ << 0xc) + (uVar1075 & 0xfffffffffffff);
  auVar406._8_8_ = 0;
  auVar406._0_8_ = uVar1078 >> 0x34 | auVar1025._8_8_ << 0xc;
  auVar1026 = auVar406 * ZEXT816(0x1000003d10) + auVar1026;
  uVar1078 = auVar1026._0_8_;
  uVar1075 = uVar1078 & 0xfffffffffffff;
  uVar1082 = (uVar1078 >> 0x34 | auVar1026._8_8_ << 0xc) + (uVar1077 & 0xffffffffffff);
  auVar407._8_8_ = 0;
  auVar407._0_8_ = local_238._0_8_;
  auVar812._8_8_ = 0;
  auVar812._0_8_ = uVar1075;
  auVar408._8_8_ = 0;
  auVar408._0_8_ = local_238._8_8_;
  auVar813._8_8_ = 0;
  auVar813._0_8_ = uVar1070;
  auVar409._8_8_ = 0;
  auVar409._0_8_ = local_228._0_8_;
  auVar814._8_8_ = 0;
  auVar814._0_8_ = uVar1074;
  auVar410._8_8_ = 0;
  auVar410._0_8_ = local_228._8_8_;
  auVar815._8_8_ = 0;
  auVar815._0_8_ = uVar1072;
  auVar411._8_8_ = 0;
  auVar411._0_8_ = local_218;
  auVar816._8_8_ = 0;
  auVar816._0_8_ = uVar1082;
  uVar1077 = SUB168(auVar411 * auVar816,0);
  auVar412._8_8_ = 0;
  auVar412._0_8_ = uVar1077 & 0xfffffffffffff;
  auVar1089 = auVar408 * auVar813 + auVar407 * auVar812 + auVar409 * auVar814 + auVar410 * auVar815
              + auVar412 * ZEXT816(0x1000003d10);
  uVar1078 = auVar1089._0_8_;
  auVar1027._8_8_ = 0;
  auVar1027._0_8_ = uVar1078 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar413._8_8_ = 0;
  auVar413._0_8_ = local_238._0_8_;
  auVar817._8_8_ = 0;
  auVar817._0_8_ = uVar1082;
  auVar414._8_8_ = 0;
  auVar414._0_8_ = local_238._8_8_;
  auVar818._8_8_ = 0;
  auVar818._0_8_ = uVar1075;
  auVar415._8_8_ = 0;
  auVar415._0_8_ = local_228._0_8_;
  auVar819._8_8_ = 0;
  auVar819._0_8_ = uVar1070;
  auVar416._8_8_ = 0;
  auVar416._0_8_ = local_228._8_8_;
  auVar820._8_8_ = 0;
  auVar820._0_8_ = uVar1074;
  auVar417._8_8_ = 0;
  auVar417._0_8_ = local_218;
  auVar821._8_8_ = 0;
  auVar821._0_8_ = uVar1072;
  auVar418._8_8_ = 0;
  auVar418._0_8_ = uVar1077 >> 0x34 | SUB168(auVar411 * auVar816,8) << 0xc;
  auVar1089 = auVar413 * auVar817 + auVar1027 + auVar414 * auVar818 + auVar415 * auVar819 +
              auVar416 * auVar820 + auVar417 * auVar821 + auVar418 * ZEXT816(0x1000003d10);
  uVar1077 = auVar1089._0_8_;
  auVar1028._8_8_ = 0;
  auVar1028._0_8_ = uVar1077 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar419._8_8_ = 0;
  auVar419._0_8_ = local_238._0_8_;
  auVar822._8_8_ = 0;
  auVar822._0_8_ = uVar1072;
  auVar420._8_8_ = 0;
  auVar420._0_8_ = local_238._8_8_;
  auVar823._8_8_ = 0;
  auVar823._0_8_ = uVar1082;
  auVar421._8_8_ = 0;
  auVar421._0_8_ = local_228._0_8_;
  auVar824._8_8_ = 0;
  auVar824._0_8_ = uVar1075;
  auVar422._8_8_ = 0;
  auVar422._0_8_ = local_228._8_8_;
  auVar825._8_8_ = 0;
  auVar825._0_8_ = uVar1070;
  auVar423._8_8_ = 0;
  auVar423._0_8_ = local_218;
  auVar826._8_8_ = 0;
  auVar826._0_8_ = uVar1074;
  auVar1089 = auVar420 * auVar823 + auVar1028 + auVar421 * auVar824 + auVar422 * auVar825 +
              auVar423 * auVar826;
  uVar1081 = auVar1089._0_8_;
  auVar1030._8_8_ = 0;
  auVar1030._0_8_ = uVar1081 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar827._8_8_ = 0;
  auVar827._0_8_ = (uVar1081 & 0xfffffffffffff) << 4 | (uVar1077 & 0xfffffffffffff) >> 0x30;
  auVar1089 = auVar419 * auVar822 + ZEXT816(0x1000003d1) * auVar827;
  uVar1083 = auVar1089._0_8_;
  auVar1029._8_8_ = 0;
  auVar1029._0_8_ = uVar1083 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar424._8_8_ = 0;
  auVar424._0_8_ = local_238._0_8_;
  auVar828._8_8_ = 0;
  auVar828._0_8_ = uVar1074;
  auVar425._8_8_ = 0;
  auVar425._0_8_ = local_238._8_8_;
  auVar829._8_8_ = 0;
  auVar829._0_8_ = uVar1072;
  auVar426._8_8_ = 0;
  auVar426._0_8_ = local_228._0_8_;
  auVar830._8_8_ = 0;
  auVar830._0_8_ = uVar1082;
  auVar427._8_8_ = 0;
  auVar427._0_8_ = local_228._8_8_;
  auVar831._8_8_ = 0;
  auVar831._0_8_ = uVar1075;
  auVar428._8_8_ = 0;
  auVar428._0_8_ = local_218;
  auVar832._8_8_ = 0;
  auVar832._0_8_ = uVar1070;
  auVar1094 = auVar426 * auVar830 + auVar1030 + auVar427 * auVar831 + auVar428 * auVar832;
  uVar1081 = auVar1094._0_8_;
  auVar429._8_8_ = 0;
  auVar429._0_8_ = uVar1081 & 0xfffffffffffff;
  auVar1089 = auVar424 * auVar828 + auVar1029 + auVar425 * auVar829 +
              auVar429 * ZEXT816(0x1000003d10);
  uVar1084 = auVar1089._0_8_;
  auVar1032._8_8_ = 0;
  auVar1032._0_8_ = uVar1081 >> 0x34 | auVar1094._8_8_ << 0xc;
  local_2c0.n[1] = uVar1084 & 0xfffffffffffff;
  auVar1031._8_8_ = 0;
  auVar1031._0_8_ = uVar1084 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar430._8_8_ = 0;
  auVar430._0_8_ = local_238._0_8_;
  auVar833._8_8_ = 0;
  auVar833._0_8_ = uVar1070;
  auVar431._8_8_ = 0;
  auVar431._0_8_ = local_238._8_8_;
  auVar834._8_8_ = 0;
  auVar834._0_8_ = uVar1074;
  auVar432._8_8_ = 0;
  auVar432._0_8_ = local_228._0_8_;
  auVar835._8_8_ = 0;
  auVar835._0_8_ = uVar1072;
  auVar433._8_8_ = 0;
  auVar433._0_8_ = local_228._8_8_;
  auVar836._8_8_ = 0;
  auVar836._0_8_ = uVar1082;
  auVar434._8_8_ = 0;
  auVar434._0_8_ = local_218;
  auVar837._8_8_ = 0;
  auVar837._0_8_ = uVar1075;
  auVar1094 = auVar433 * auVar836 + auVar1032 + auVar434 * auVar837;
  uVar1070 = auVar1094._0_8_;
  auVar435._8_8_ = 0;
  auVar435._0_8_ = uVar1070 & 0xfffffffffffff;
  auVar1089 = auVar430 * auVar833 + auVar1031 + auVar431 * auVar834 + auVar432 * auVar835 +
              auVar435 * ZEXT816(0x1000003d10);
  uVar1072 = auVar1089._0_8_;
  local_2c0.n[2] = uVar1072 & 0xfffffffffffff;
  auVar1033._8_8_ = 0;
  auVar1033._0_8_ = (uVar1072 >> 0x34 | auVar1089._8_8_ << 0xc) + (uVar1078 & 0xfffffffffffff);
  auVar436._8_8_ = 0;
  auVar436._0_8_ = uVar1070 >> 0x34 | auVar1094._8_8_ << 0xc;
  auVar1033 = auVar436 * ZEXT816(0x1000003d10) + auVar1033;
  uVar1070 = auVar1033._0_8_;
  local_2c0.n[3] = uVar1070 & 0xfffffffffffff;
  local_2c0.n[4] = (uVar1070 >> 0x34 | auVar1033._8_8_ << 0xc) + (uVar1077 & 0xffffffffffff);
  local_2c0.n[0] = (uVar1083 & 0xfffffffffffff) + 7;
  auVar437._8_8_ = 0;
  auVar437._0_8_ = local_268 * 2;
  auVar838._8_8_ = 0;
  auVar838._0_8_ = uStack_250;
  auVar438._8_8_ = 0;
  auVar438._0_8_ = uStack_260 * 2;
  auVar839._8_8_ = 0;
  auVar839._0_8_ = local_258;
  auVar439._8_8_ = 0;
  auVar439._0_8_ = local_248;
  auVar840._8_8_ = 0;
  auVar840._0_8_ = local_248;
  uVar1072 = SUB168(auVar439 * auVar840,0);
  auVar440._8_8_ = 0;
  auVar440._0_8_ = uVar1072 & 0xfffffffffffff;
  auVar1089 = auVar438 * auVar839 + auVar437 * auVar838 + auVar440 * ZEXT816(0x1000003d10);
  uVar1075 = auVar1089._0_8_;
  auVar1034._8_8_ = 0;
  auVar1034._0_8_ = uVar1075 >> 0x34 | auVar1089._8_8_ << 0xc;
  uVar1070 = local_248 * 2;
  auVar441._8_8_ = 0;
  auVar441._0_8_ = local_268;
  auVar841._8_8_ = 0;
  auVar841._0_8_ = uVar1070;
  auVar442._8_8_ = 0;
  auVar442._0_8_ = uStack_260 * 2;
  auVar842._8_8_ = 0;
  auVar842._0_8_ = uStack_250;
  auVar443._8_8_ = 0;
  auVar443._0_8_ = local_258;
  auVar843._8_8_ = 0;
  auVar843._0_8_ = local_258;
  auVar444._8_8_ = 0;
  auVar444._0_8_ = uVar1072 >> 0x34 | SUB168(auVar439 * auVar840,8) << 0xc;
  auVar1089 = auVar441 * auVar841 + auVar1034 + auVar442 * auVar842 + auVar443 * auVar843 +
              auVar444 * ZEXT816(0x1000003d10);
  uVar1077 = auVar1089._0_8_;
  auVar1035._8_8_ = 0;
  auVar1035._0_8_ = uVar1077 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar445._8_8_ = 0;
  auVar445._0_8_ = local_268;
  auVar844._8_8_ = 0;
  auVar844._0_8_ = local_268;
  auVar446._8_8_ = 0;
  auVar446._0_8_ = uStack_260;
  auVar845._8_8_ = 0;
  auVar845._0_8_ = uVar1070;
  auVar447._8_8_ = 0;
  auVar447._0_8_ = local_258 * 2;
  auVar846._8_8_ = 0;
  auVar846._0_8_ = uStack_250;
  auVar1089 = auVar446 * auVar845 + auVar1035 + auVar447 * auVar846;
  uVar1072 = auVar1089._0_8_;
  auVar1037._8_8_ = 0;
  auVar1037._0_8_ = uVar1072 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar847._8_8_ = 0;
  auVar847._0_8_ = (uVar1072 & 0xfffffffffffff) << 4 | (uVar1077 & 0xfffffffffffff) >> 0x30;
  auVar1089 = auVar445 * auVar844 + ZEXT816(0x1000003d1) * auVar847;
  uVar1074 = auVar1089._0_8_;
  uVar1072 = uVar1074 & 0xfffffffffffff;
  auVar1036._8_8_ = 0;
  auVar1036._0_8_ = uVar1074 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar448._8_8_ = 0;
  auVar448._0_8_ = local_268 * 2;
  auVar848._8_8_ = 0;
  auVar848._0_8_ = uStack_260;
  auVar449._8_8_ = 0;
  auVar449._0_8_ = local_258;
  auVar849._8_8_ = 0;
  auVar849._0_8_ = uVar1070;
  auVar450._8_8_ = 0;
  auVar450._0_8_ = uStack_250;
  auVar850._8_8_ = 0;
  auVar850._0_8_ = uStack_250;
  auVar1094 = auVar449 * auVar849 + auVar1037 + auVar450 * auVar850;
  uVar1074 = auVar1094._0_8_;
  auVar451._8_8_ = 0;
  auVar451._0_8_ = uVar1074 & 0xfffffffffffff;
  auVar1089 = auVar448 * auVar848 + auVar1036 + auVar451 * ZEXT816(0x1000003d10);
  uVar1078 = auVar1089._0_8_;
  auVar1039._8_8_ = 0;
  auVar1039._0_8_ = uVar1074 >> 0x34 | auVar1094._8_8_ << 0xc;
  uVar1074 = uVar1078 & 0xfffffffffffff;
  auVar1038._8_8_ = 0;
  auVar1038._0_8_ = uVar1078 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar452._8_8_ = 0;
  auVar452._0_8_ = local_268 * 2;
  auVar851._8_8_ = 0;
  auVar851._0_8_ = local_258;
  auVar453._8_8_ = 0;
  auVar453._0_8_ = uStack_260;
  auVar852._8_8_ = 0;
  auVar852._0_8_ = uStack_260;
  auVar454._8_8_ = 0;
  auVar454._0_8_ = uStack_250;
  auVar853._8_8_ = 0;
  auVar853._0_8_ = uVar1070;
  auVar1039 = auVar454 * auVar853 + auVar1039;
  uVar1078 = auVar1039._0_8_;
  auVar455._8_8_ = 0;
  auVar455._0_8_ = uVar1078 & 0xfffffffffffff;
  auVar1089 = auVar452 * auVar851 + auVar1038 + auVar453 * auVar852 +
              auVar455 * ZEXT816(0x1000003d10);
  uVar1081 = auVar1089._0_8_;
  uVar1070 = uVar1081 & 0xfffffffffffff;
  auVar1040._8_8_ = 0;
  auVar1040._0_8_ = (uVar1081 >> 0x34 | auVar1089._8_8_ << 0xc) + (uVar1075 & 0xfffffffffffff);
  auVar456._8_8_ = 0;
  auVar456._0_8_ = uVar1078 >> 0x34 | auVar1039._8_8_ << 0xc;
  auVar1040 = auVar456 * ZEXT816(0x1000003d10) + auVar1040;
  uVar1078 = auVar1040._0_8_;
  uVar1075 = uVar1078 & 0xfffffffffffff;
  uVar1082 = (uVar1078 >> 0x34 | auVar1040._8_8_ << 0xc) + (uVar1077 & 0xffffffffffff);
  auVar457._8_8_ = 0;
  auVar457._0_8_ = local_268;
  auVar854._8_8_ = 0;
  auVar854._0_8_ = uVar1075;
  auVar458._8_8_ = 0;
  auVar458._0_8_ = uStack_260;
  auVar855._8_8_ = 0;
  auVar855._0_8_ = uVar1070;
  auVar459._8_8_ = 0;
  auVar459._0_8_ = local_258;
  auVar856._8_8_ = 0;
  auVar856._0_8_ = uVar1074;
  auVar460._8_8_ = 0;
  auVar460._0_8_ = uStack_250;
  auVar857._8_8_ = 0;
  auVar857._0_8_ = uVar1072;
  auVar461._8_8_ = 0;
  auVar461._0_8_ = local_248;
  auVar858._8_8_ = 0;
  auVar858._0_8_ = uVar1082;
  uVar1077 = SUB168(auVar461 * auVar858,0);
  auVar462._8_8_ = 0;
  auVar462._0_8_ = uVar1077 & 0xfffffffffffff;
  auVar1089 = auVar458 * auVar855 + auVar457 * auVar854 + auVar459 * auVar856 + auVar460 * auVar857
              + auVar462 * ZEXT816(0x1000003d10);
  uVar1078 = auVar1089._0_8_;
  auVar1041._8_8_ = 0;
  auVar1041._0_8_ = uVar1078 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar463._8_8_ = 0;
  auVar463._0_8_ = local_268;
  auVar859._8_8_ = 0;
  auVar859._0_8_ = uVar1082;
  auVar464._8_8_ = 0;
  auVar464._0_8_ = uStack_260;
  auVar860._8_8_ = 0;
  auVar860._0_8_ = uVar1075;
  auVar465._8_8_ = 0;
  auVar465._0_8_ = local_258;
  auVar861._8_8_ = 0;
  auVar861._0_8_ = uVar1070;
  auVar466._8_8_ = 0;
  auVar466._0_8_ = uStack_250;
  auVar862._8_8_ = 0;
  auVar862._0_8_ = uVar1074;
  auVar467._8_8_ = 0;
  auVar467._0_8_ = local_248;
  auVar863._8_8_ = 0;
  auVar863._0_8_ = uVar1072;
  auVar468._8_8_ = 0;
  auVar468._0_8_ = uVar1077 >> 0x34 | SUB168(auVar461 * auVar858,8) << 0xc;
  auVar1089 = auVar463 * auVar859 + auVar1041 + auVar464 * auVar860 + auVar465 * auVar861 +
              auVar466 * auVar862 + auVar467 * auVar863 + auVar468 * ZEXT816(0x1000003d10);
  uVar1077 = auVar1089._0_8_;
  auVar1042._8_8_ = 0;
  auVar1042._0_8_ = uVar1077 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar469._8_8_ = 0;
  auVar469._0_8_ = local_268;
  auVar864._8_8_ = 0;
  auVar864._0_8_ = uVar1072;
  auVar470._8_8_ = 0;
  auVar470._0_8_ = uStack_260;
  auVar865._8_8_ = 0;
  auVar865._0_8_ = uVar1082;
  auVar471._8_8_ = 0;
  auVar471._0_8_ = local_258;
  auVar866._8_8_ = 0;
  auVar866._0_8_ = uVar1075;
  auVar472._8_8_ = 0;
  auVar472._0_8_ = uStack_250;
  auVar867._8_8_ = 0;
  auVar867._0_8_ = uVar1070;
  auVar473._8_8_ = 0;
  auVar473._0_8_ = local_248;
  auVar868._8_8_ = 0;
  auVar868._0_8_ = uVar1074;
  auVar1089 = auVar470 * auVar865 + auVar1042 + auVar471 * auVar866 + auVar472 * auVar867 +
              auVar473 * auVar868;
  uVar1081 = auVar1089._0_8_;
  auVar1044._8_8_ = 0;
  auVar1044._0_8_ = uVar1081 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar869._8_8_ = 0;
  auVar869._0_8_ = (uVar1081 & 0xfffffffffffff) << 4 | (uVar1077 & 0xfffffffffffff) >> 0x30;
  auVar1089 = auVar469 * auVar864 + ZEXT816(0x1000003d1) * auVar869;
  uVar1083 = auVar1089._0_8_;
  auVar1043._8_8_ = 0;
  auVar1043._0_8_ = uVar1083 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar474._8_8_ = 0;
  auVar474._0_8_ = local_268;
  auVar870._8_8_ = 0;
  auVar870._0_8_ = uVar1074;
  auVar475._8_8_ = 0;
  auVar475._0_8_ = uStack_260;
  auVar871._8_8_ = 0;
  auVar871._0_8_ = uVar1072;
  auVar476._8_8_ = 0;
  auVar476._0_8_ = local_258;
  auVar872._8_8_ = 0;
  auVar872._0_8_ = uVar1082;
  auVar477._8_8_ = 0;
  auVar477._0_8_ = uStack_250;
  auVar873._8_8_ = 0;
  auVar873._0_8_ = uVar1075;
  auVar478._8_8_ = 0;
  auVar478._0_8_ = local_248;
  auVar874._8_8_ = 0;
  auVar874._0_8_ = uVar1070;
  auVar1094 = auVar476 * auVar872 + auVar1044 + auVar477 * auVar873 + auVar478 * auVar874;
  uVar1081 = auVar1094._0_8_;
  auVar479._8_8_ = 0;
  auVar479._0_8_ = uVar1081 & 0xfffffffffffff;
  auVar1089 = auVar474 * auVar870 + auVar1043 + auVar475 * auVar871 +
              auVar479 * ZEXT816(0x1000003d10);
  uVar1084 = auVar1089._0_8_;
  auVar1046._8_8_ = 0;
  auVar1046._0_8_ = uVar1081 >> 0x34 | auVar1094._8_8_ << 0xc;
  local_2e8.n[1] = uVar1084 & 0xfffffffffffff;
  auVar1045._8_8_ = 0;
  auVar1045._0_8_ = uVar1084 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar480._8_8_ = 0;
  auVar480._0_8_ = local_268;
  auVar875._8_8_ = 0;
  auVar875._0_8_ = uVar1070;
  auVar481._8_8_ = 0;
  auVar481._0_8_ = uStack_260;
  auVar876._8_8_ = 0;
  auVar876._0_8_ = uVar1074;
  auVar482._8_8_ = 0;
  auVar482._0_8_ = local_258;
  auVar877._8_8_ = 0;
  auVar877._0_8_ = uVar1072;
  auVar483._8_8_ = 0;
  auVar483._0_8_ = uStack_250;
  auVar878._8_8_ = 0;
  auVar878._0_8_ = uVar1082;
  auVar484._8_8_ = 0;
  auVar484._0_8_ = local_248;
  auVar879._8_8_ = 0;
  auVar879._0_8_ = uVar1075;
  auVar1094 = auVar483 * auVar878 + auVar1046 + auVar484 * auVar879;
  uVar1070 = auVar1094._0_8_;
  auVar485._8_8_ = 0;
  auVar485._0_8_ = uVar1070 & 0xfffffffffffff;
  auVar1089 = auVar480 * auVar875 + auVar1045 + auVar481 * auVar876 + auVar482 * auVar877 +
              auVar485 * ZEXT816(0x1000003d10);
  uVar1072 = auVar1089._0_8_;
  local_2e8.n[2] = uVar1072 & 0xfffffffffffff;
  auVar1047._8_8_ = 0;
  auVar1047._0_8_ = (uVar1072 >> 0x34 | auVar1089._8_8_ << 0xc) + (uVar1078 & 0xfffffffffffff);
  auVar486._8_8_ = 0;
  auVar486._0_8_ = uVar1070 >> 0x34 | auVar1094._8_8_ << 0xc;
  auVar1047 = auVar486 * ZEXT816(0x1000003d10) + auVar1047;
  uVar1070 = auVar1047._0_8_;
  local_2e8.n[3] = uVar1070 & 0xfffffffffffff;
  local_2e8.n[4] = (uVar1070 >> 0x34 | auVar1047._8_8_ << 0xc) + (uVar1077 & 0xffffffffffff);
  local_2e8.n[0] = (uVar1083 & 0xfffffffffffff) + 7;
  auVar487._8_8_ = 0;
  auVar487._0_8_ = uVar1079 * 2;
  auVar880._8_8_ = 0;
  auVar880._0_8_ = uVar1076;
  auVar488._8_8_ = 0;
  auVar488._0_8_ = uVar1071 * 2;
  auVar881._8_8_ = 0;
  auVar881._0_8_ = uVar1073;
  auVar489._8_8_ = 0;
  auVar489._0_8_ = uVar1080;
  auVar882._8_8_ = 0;
  auVar882._0_8_ = uVar1080;
  uVar1072 = SUB168(auVar489 * auVar882,0);
  auVar490._8_8_ = 0;
  auVar490._0_8_ = uVar1072 & 0xfffffffffffff;
  auVar1089 = auVar488 * auVar881 + auVar487 * auVar880 + auVar490 * ZEXT816(0x1000003d10);
  uVar1075 = auVar1089._0_8_;
  auVar1048._8_8_ = 0;
  auVar1048._0_8_ = uVar1075 >> 0x34 | auVar1089._8_8_ << 0xc;
  uVar1070 = uVar1080 * 2;
  auVar491._8_8_ = 0;
  auVar491._0_8_ = uVar1079;
  auVar883._8_8_ = 0;
  auVar883._0_8_ = uVar1070;
  auVar492._8_8_ = 0;
  auVar492._0_8_ = uVar1071 * 2;
  auVar884._8_8_ = 0;
  auVar884._0_8_ = uVar1076;
  auVar493._8_8_ = 0;
  auVar493._0_8_ = uVar1073;
  auVar885._8_8_ = 0;
  auVar885._0_8_ = uVar1073;
  auVar494._8_8_ = 0;
  auVar494._0_8_ = uVar1072 >> 0x34 | SUB168(auVar489 * auVar882,8) << 0xc;
  auVar1089 = auVar491 * auVar883 + auVar1048 + auVar492 * auVar884 + auVar493 * auVar885 +
              auVar494 * ZEXT816(0x1000003d10);
  uVar1077 = auVar1089._0_8_;
  auVar1049._8_8_ = 0;
  auVar1049._0_8_ = uVar1077 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar495._8_8_ = 0;
  auVar495._0_8_ = uVar1079;
  auVar886._8_8_ = 0;
  auVar886._0_8_ = uVar1079;
  auVar496._8_8_ = 0;
  auVar496._0_8_ = uVar1071;
  auVar887._8_8_ = 0;
  auVar887._0_8_ = uVar1070;
  auVar497._8_8_ = 0;
  auVar497._0_8_ = uVar1073 * 2;
  auVar888._8_8_ = 0;
  auVar888._0_8_ = uVar1076;
  auVar1089 = auVar496 * auVar887 + auVar1049 + auVar497 * auVar888;
  uVar1072 = auVar1089._0_8_;
  auVar1051._8_8_ = 0;
  auVar1051._0_8_ = uVar1072 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar889._8_8_ = 0;
  auVar889._0_8_ = (uVar1072 & 0xfffffffffffff) << 4 | (uVar1077 & 0xfffffffffffff) >> 0x30;
  auVar1089 = auVar495 * auVar886 + ZEXT816(0x1000003d1) * auVar889;
  uVar1074 = auVar1089._0_8_;
  uVar1072 = uVar1074 & 0xfffffffffffff;
  auVar1050._8_8_ = 0;
  auVar1050._0_8_ = uVar1074 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar498._8_8_ = 0;
  auVar498._0_8_ = uVar1079 * 2;
  auVar890._8_8_ = 0;
  auVar890._0_8_ = uVar1071;
  auVar499._8_8_ = 0;
  auVar499._0_8_ = uVar1073;
  auVar891._8_8_ = 0;
  auVar891._0_8_ = uVar1070;
  auVar500._8_8_ = 0;
  auVar500._0_8_ = uVar1076;
  auVar892._8_8_ = 0;
  auVar892._0_8_ = uVar1076;
  auVar1094 = auVar499 * auVar891 + auVar1051 + auVar500 * auVar892;
  uVar1074 = auVar1094._0_8_;
  auVar501._8_8_ = 0;
  auVar501._0_8_ = uVar1074 & 0xfffffffffffff;
  auVar1089 = auVar498 * auVar890 + auVar1050 + auVar501 * ZEXT816(0x1000003d10);
  uVar1078 = auVar1089._0_8_;
  auVar1053._8_8_ = 0;
  auVar1053._0_8_ = uVar1074 >> 0x34 | auVar1094._8_8_ << 0xc;
  uVar1074 = uVar1078 & 0xfffffffffffff;
  auVar1052._8_8_ = 0;
  auVar1052._0_8_ = uVar1078 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar502._8_8_ = 0;
  auVar502._0_8_ = uVar1079 * 2;
  auVar893._8_8_ = 0;
  auVar893._0_8_ = uVar1073;
  auVar503._8_8_ = 0;
  auVar503._0_8_ = uVar1071;
  auVar894._8_8_ = 0;
  auVar894._0_8_ = uVar1071;
  auVar504._8_8_ = 0;
  auVar504._0_8_ = uVar1076;
  auVar895._8_8_ = 0;
  auVar895._0_8_ = uVar1070;
  auVar1053 = auVar504 * auVar895 + auVar1053;
  uVar1078 = auVar1053._0_8_;
  auVar505._8_8_ = 0;
  auVar505._0_8_ = uVar1078 & 0xfffffffffffff;
  auVar1089 = auVar502 * auVar893 + auVar1052 + auVar503 * auVar894 +
              auVar505 * ZEXT816(0x1000003d10);
  uVar1081 = auVar1089._0_8_;
  uVar1070 = uVar1081 & 0xfffffffffffff;
  auVar1054._8_8_ = 0;
  auVar1054._0_8_ = (uVar1081 >> 0x34 | auVar1089._8_8_ << 0xc) + (uVar1075 & 0xfffffffffffff);
  auVar506._8_8_ = 0;
  auVar506._0_8_ = uVar1078 >> 0x34 | auVar1053._8_8_ << 0xc;
  auVar1054 = auVar506 * ZEXT816(0x1000003d10) + auVar1054;
  uVar1078 = auVar1054._0_8_;
  uVar1075 = uVar1078 & 0xfffffffffffff;
  uVar1081 = (uVar1078 >> 0x34 | auVar1054._8_8_ << 0xc) + (uVar1077 & 0xffffffffffff);
  auVar507._8_8_ = 0;
  auVar507._0_8_ = uVar1079;
  auVar896._8_8_ = 0;
  auVar896._0_8_ = uVar1075;
  auVar508._8_8_ = 0;
  auVar508._0_8_ = uVar1071;
  auVar897._8_8_ = 0;
  auVar897._0_8_ = uVar1070;
  auVar509._8_8_ = 0;
  auVar509._0_8_ = uVar1073;
  auVar898._8_8_ = 0;
  auVar898._0_8_ = uVar1074;
  auVar510._8_8_ = 0;
  auVar510._0_8_ = uVar1076;
  auVar899._8_8_ = 0;
  auVar899._0_8_ = uVar1072;
  auVar511._8_8_ = 0;
  auVar511._0_8_ = uVar1080;
  auVar900._8_8_ = 0;
  auVar900._0_8_ = uVar1081;
  uVar1077 = SUB168(auVar511 * auVar900,0);
  auVar512._8_8_ = 0;
  auVar512._0_8_ = uVar1077 & 0xfffffffffffff;
  auVar1089 = auVar508 * auVar897 + auVar507 * auVar896 + auVar509 * auVar898 + auVar510 * auVar899
              + auVar512 * ZEXT816(0x1000003d10);
  uVar1078 = auVar1089._0_8_;
  local_298._0_8_ = uVar1078 & 0xfffffffffffff;
  auVar1055._8_8_ = 0;
  auVar1055._0_8_ = uVar1078 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar513._8_8_ = 0;
  auVar513._0_8_ = uVar1079;
  auVar901._8_8_ = 0;
  auVar901._0_8_ = uVar1081;
  auVar514._8_8_ = 0;
  auVar514._0_8_ = uVar1071;
  auVar902._8_8_ = 0;
  auVar902._0_8_ = uVar1075;
  auVar515._8_8_ = 0;
  auVar515._0_8_ = uVar1073;
  auVar903._8_8_ = 0;
  auVar903._0_8_ = uVar1070;
  auVar516._8_8_ = 0;
  auVar516._0_8_ = uVar1076;
  auVar904._8_8_ = 0;
  auVar904._0_8_ = uVar1074;
  auVar517._8_8_ = 0;
  auVar517._0_8_ = uVar1080;
  auVar905._8_8_ = 0;
  auVar905._0_8_ = uVar1072;
  auVar518._8_8_ = 0;
  auVar518._0_8_ = uVar1077 >> 0x34 | SUB168(auVar511 * auVar900,8) << 0xc;
  auVar1089 = auVar513 * auVar901 + auVar1055 + auVar514 * auVar902 + auVar515 * auVar903 +
              auVar516 * auVar904 + auVar517 * auVar905 + auVar518 * ZEXT816(0x1000003d10);
  local_138._0_8_ = auVar1089._0_8_;
  auVar1056._8_8_ = 0;
  auVar1056._0_8_ = (ulong)local_138._0_8_ >> 0x34 | auVar1089._8_8_ << 0xc;
  local_d8._0_8_ = (local_138._0_8_ & 0xfffffffffffff) >> 0x30;
  local_138._0_8_ = local_138._0_8_ & 0xffffffffffff;
  auVar519._8_8_ = 0;
  auVar519._0_8_ = uVar1079;
  auVar906._8_8_ = 0;
  auVar906._0_8_ = uVar1072;
  auVar520._8_8_ = 0;
  auVar520._0_8_ = uVar1071;
  auVar907._8_8_ = 0;
  auVar907._0_8_ = uVar1081;
  auVar521._8_8_ = 0;
  auVar521._0_8_ = uVar1073;
  auVar908._8_8_ = 0;
  auVar908._0_8_ = uVar1075;
  auVar522._8_8_ = 0;
  auVar522._0_8_ = uVar1076;
  auVar909._8_8_ = 0;
  auVar909._0_8_ = uVar1070;
  auVar523._8_8_ = 0;
  auVar523._0_8_ = uVar1080;
  auVar910._8_8_ = 0;
  auVar910._0_8_ = uVar1074;
  auVar1089 = auVar520 * auVar907 + auVar1056 + auVar521 * auVar908 + auVar522 * auVar909 +
              auVar523 * auVar910;
  uVar1077 = auVar1089._0_8_;
  auVar1058._8_8_ = 0;
  auVar1058._0_8_ = uVar1077 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar911._8_8_ = 0;
  auVar911._0_8_ = (uVar1077 & 0xfffffffffffff) << 4 | local_d8._0_8_;
  auVar1089 = auVar519 * auVar906 + ZEXT816(0x1000003d1) * auVar911;
  uVar1078 = auVar1089._0_8_;
  auVar1057._8_8_ = 0;
  auVar1057._0_8_ = uVar1078 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar524._8_8_ = 0;
  auVar524._0_8_ = uVar1079;
  auVar912._8_8_ = 0;
  auVar912._0_8_ = uVar1074;
  auVar525._8_8_ = 0;
  auVar525._0_8_ = uVar1071;
  auVar913._8_8_ = 0;
  auVar913._0_8_ = uVar1072;
  auVar526._8_8_ = 0;
  auVar526._0_8_ = uVar1073;
  auVar914._8_8_ = 0;
  auVar914._0_8_ = uVar1081;
  auVar527._8_8_ = 0;
  auVar527._0_8_ = uVar1076;
  auVar915._8_8_ = 0;
  auVar915._0_8_ = uVar1075;
  auVar528._8_8_ = 0;
  auVar528._0_8_ = uVar1080;
  auVar916._8_8_ = 0;
  auVar916._0_8_ = uVar1070;
  auVar1094 = auVar526 * auVar914 + auVar1058 + auVar527 * auVar915 + auVar528 * auVar916;
  uVar1077 = auVar1094._0_8_;
  auVar529._8_8_ = 0;
  auVar529._0_8_ = uVar1077 & 0xfffffffffffff;
  auVar1089 = auVar524 * auVar912 + auVar1057 + auVar525 * auVar913 +
              auVar529 * ZEXT816(0x1000003d10);
  uVar1082 = auVar1089._0_8_;
  auVar1060._8_8_ = 0;
  auVar1060._0_8_ = uVar1077 >> 0x34 | auVar1094._8_8_ << 0xc;
  local_1b0.n[1] = uVar1082 & 0xfffffffffffff;
  auVar1059._8_8_ = 0;
  auVar1059._0_8_ = uVar1082 >> 0x34 | auVar1089._8_8_ << 0xc;
  auVar530._8_8_ = 0;
  auVar530._0_8_ = uVar1079;
  auVar917._8_8_ = 0;
  auVar917._0_8_ = uVar1070;
  auVar531._8_8_ = 0;
  auVar531._0_8_ = uVar1071;
  auVar918._8_8_ = 0;
  auVar918._0_8_ = uVar1074;
  auVar532._8_8_ = 0;
  auVar532._0_8_ = uVar1073;
  auVar919._8_8_ = 0;
  auVar919._0_8_ = uVar1072;
  auVar533._8_8_ = 0;
  auVar533._0_8_ = uVar1076;
  auVar920._8_8_ = 0;
  auVar920._0_8_ = uVar1081;
  auVar534._8_8_ = 0;
  auVar534._0_8_ = uVar1080;
  auVar921._8_8_ = 0;
  auVar921._0_8_ = uVar1075;
  auVar1094 = auVar533 * auVar920 + auVar1060 + auVar534 * auVar921;
  uVar1070 = auVar1094._0_8_;
  auVar535._8_8_ = 0;
  auVar535._0_8_ = uVar1070 & 0xfffffffffffff;
  auVar1089 = auVar530 * auVar917 + auVar1059 + auVar531 * auVar918 + auVar532 * auVar919 +
              auVar535 * ZEXT816(0x1000003d10);
  uVar1072 = auVar1089._0_8_;
  local_1b0.n[2] = uVar1072 & 0xfffffffffffff;
  auVar1061._8_8_ = 0;
  auVar1061._0_8_ = (uVar1072 >> 0x34 | auVar1089._8_8_ << 0xc) + local_298._0_8_;
  auVar536._8_8_ = 0;
  auVar536._0_8_ = uVar1070 >> 0x34 | auVar1094._8_8_ << 0xc;
  auVar1061 = auVar536 * ZEXT816(0x1000003d10) + auVar1061;
  uVar1070 = auVar1061._0_8_;
  local_1b0.n[3] = uVar1070 & 0xfffffffffffff;
  local_1b0.n[4] = (uVar1070 >> 0x34 | auVar1061._8_8_ << 0xc) + local_138._0_8_;
  local_1b0.n[0] = (uVar1078 & 0xfffffffffffff) + 7;
  uVar1068 = secp256k1_fe_sqrt((secp256k1_fe *)local_298,&local_2c0);
  uVar1069 = secp256k1_fe_sqrt((secp256k1_fe *)local_138,&local_2e8);
  secp256k1_fe_sqrt((secp256k1_fe *)local_d8,&local_1b0);
  uVar1074 = (ulong)((uVar1068 ^ 1) & uVar1069);
  uVar1070 = uVar1074 - 1;
  uVar1074 = -uVar1074;
  uVar1075 = (ulong)(~uVar1069 & (uVar1068 ^ 1));
  uVar1072 = uVar1075 - 1;
  uVar1075 = -uVar1075;
  auVar1086._8_4_ = (int)uVar1070;
  auVar1086._0_8_ = uVar1070;
  auVar1086._12_4_ = (int)(uVar1070 >> 0x20);
  auVar1085._8_4_ = (int)uVar1074;
  auVar1085._0_8_ = uVar1074;
  auVar1085._12_4_ = (int)(uVar1074 >> 0x20);
  auVar1064._8_8_ = uStack_260;
  auVar1064._0_8_ = local_268;
  auVar1091._8_4_ = (int)uVar1072;
  auVar1091._0_8_ = uVar1072;
  auVar1091._12_4_ = (int)(uVar1072 >> 0x20);
  auVar1088._8_4_ = (int)uVar1075;
  auVar1088._0_8_ = uVar1075;
  auVar1088._12_4_ = (int)(uVar1075 >> 0x20);
  auVar1062._8_8_ = uVar1071;
  auVar1062._0_8_ = uVar1079;
  auVar1096 = auVar1062 & auVar1088 | (auVar1064 & auVar1085 | local_238 & auVar1086) & auVar1091;
  auVar1065._8_8_ = uStack_250;
  auVar1065._0_8_ = local_258;
  auVar1063._8_8_ = uVar1076;
  auVar1063._0_8_ = uVar1073;
  auVar1094 = auVar1063 & auVar1088 | (auVar1065 & auVar1085 | local_228 & auVar1086) & auVar1091;
  auVar1066._8_8_ = local_138._8_8_;
  auVar1066._0_8_ = local_138._0_8_;
  auVar1067._8_8_ = local_d8._8_8_;
  auVar1067._0_8_ = local_d8._0_8_;
  auVar1095 = auVar1067 & auVar1088 | (auVar1066 & auVar1085 | local_298 & auVar1086) & auVar1091;
  auVar1089 = auVar1088 & local_d8._16_16_ |
              (auVar1085 & local_138._16_16_ | auVar1086 & local_288) & auVar1091;
  uVar1073 = uVar1075 & local_b8 | (uVar1074 & local_118 | uVar1070 & local_278) & uVar1072;
  ge->infinity = 0;
  (ge->x).n[4] = uVar1080 & uVar1075 | (local_248 & uVar1074 | local_218 & uVar1070) & uVar1072;
  local_238._0_8_ = auVar1096._0_8_;
  local_238._8_8_ = auVar1096._8_8_;
  local_228._0_8_ = auVar1094._0_8_;
  local_228._8_8_ = auVar1094._8_8_;
  (ge->x).n[2] = local_228._0_8_;
  (ge->x).n[3] = local_228._8_8_;
  (ge->x).n[0] = local_238._0_8_;
  (ge->x).n[1] = local_238._8_8_;
  (ge->y).n[4] = uVar1073;
  local_298._0_8_ = auVar1095._0_8_;
  local_298._8_8_ = auVar1095._8_8_;
  local_288._0_8_ = auVar1089._0_8_;
  local_288._8_8_ = auVar1089._8_8_;
  (ge->y).n[2] = local_288._0_8_;
  (ge->y).n[3] = local_288._8_8_;
  (ge->y).n[0] = local_298._0_8_;
  (ge->y).n[1] = local_298._8_8_;
  uVar1072 = (ulong)((uint)t->n[0] & 1);
  uVar1070 = uVar1072 - 1;
  uVar1072 = -uVar1072;
  auVar1089 = *(undefined1 (*) [16])(ge->y).n;
  auVar1092._0_8_ = 0x3ffffbfffff0bc - auVar1089._0_8_;
  auVar1092._8_8_ = 0x3ffffffffffffc - auVar1089._8_8_;
  auVar1087._8_4_ = (int)uVar1070;
  auVar1087._0_8_ = uVar1070;
  auVar1087._12_4_ = (int)(uVar1070 >> 0x20);
  auVar1090._8_4_ = (int)uVar1072;
  auVar1090._0_8_ = uVar1072;
  auVar1090._12_4_ = (int)(uVar1072 >> 0x20);
  *(undefined1 (*) [16])(ge->y).n = auVar1092 & auVar1090 | auVar1089 & auVar1087;
  auVar1089 = *(undefined1 (*) [16])((ge->y).n + 2);
  auVar1093._0_8_ = 0x3ffffffffffffc - auVar1089._0_8_;
  auVar1093._8_8_ = 0x3ffffffffffffc - auVar1089._8_8_;
  *(undefined1 (*) [16])((ge->y).n + 2) = auVar1093 & auVar1090 | auVar1087 & auVar1089;
  (ge->y).n[4] = uVar1072 & 0x3fffffffffffc - uVar1073 | uVar1070 & uVar1073;
  return;
}

Assistant:

static void shallue_van_de_woestijne(secp256k1_ge* ge, const secp256k1_fe* t) {
    /* Implements the algorithm from:
     *    Indifferentiable Hashing to Barreto-Naehrig Curves
     *    Pierre-Alain Fouque and Mehdi Tibouchi
     *    Latincrypt 2012
     */

    /* Basic algorithm:

       c = sqrt(-3)
       d = (c - 1)/2

       w = c * t / (1 + b + t^2)  [with b = 7]
       x1 = d - t*w
       x2 = -(x1 + 1)
       x3 = 1 + 1/w^2

       To avoid the 2 divisions, compute the above in numerator/denominator form:
       wn = c * t
       wd = 1 + 7 + t^2
       x1n = d*wd - t*wn
       x1d = wd
       x2n = -(x1n + wd)
       x2d = wd
       x3n = wd^2 + c^2 + t^2
       x3d = (c * t)^2

       The joint denominator j = wd * c^2 * t^2, and
       1 / x1d = 1/j * c^2 * t^2
       1 / x2d = x3d = 1/j * wd
    */

    static const secp256k1_fe c = SECP256K1_FE_CONST(0x0a2d2ba9, 0x3507f1df, 0x233770c2, 0xa797962c, 0xc61f6d15, 0xda14ecd4, 0x7d8d27ae, 0x1cd5f852);
    static const secp256k1_fe d = SECP256K1_FE_CONST(0x851695d4, 0x9a83f8ef, 0x919bb861, 0x53cbcb16, 0x630fb68a, 0xed0a766a, 0x3ec693d6, 0x8e6afa40);
    static const secp256k1_fe b = SECP256K1_FE_CONST(0, 0, 0, 0, 0, 0, 0, 7);
    static const secp256k1_fe b_plus_one = SECP256K1_FE_CONST(0, 0, 0, 0, 0, 0, 0, 8);

    secp256k1_fe wn, wd, x1n, x2n, x3n, x3d, jinv, tmp, x1, x2, x3, alphain, betain, gammain, y1, y2, y3;
    int alphaquad, betaquad;

    secp256k1_fe_mul(&wn, &c, t); /* mag 1 */
    secp256k1_fe_sqr(&wd, t); /* mag 1 */
    secp256k1_fe_add(&wd, &b_plus_one); /* mag 2 */
    secp256k1_fe_mul(&tmp, t, &wn); /* mag 1 */
    secp256k1_fe_negate(&tmp, &tmp, 1); /* mag 2 */
    secp256k1_fe_mul(&x1n, &d, &wd); /* mag 1 */
    secp256k1_fe_add(&x1n, &tmp); /* mag 3 */
    x2n = x1n; /* mag 3 */
    secp256k1_fe_add(&x2n, &wd); /* mag 5 */
    secp256k1_fe_negate(&x2n, &x2n, 5); /* mag 6 */
    secp256k1_fe_mul(&x3d, &c, t); /* mag 1 */
    secp256k1_fe_sqr(&x3d, &x3d); /* mag 1 */
    secp256k1_fe_sqr(&x3n, &wd); /* mag 1 */
    secp256k1_fe_add(&x3n, &x3d); /* mag 2 */
    secp256k1_fe_mul(&jinv, &x3d, &wd); /* mag 1 */
    secp256k1_fe_inv(&jinv, &jinv); /* mag 1 */
    secp256k1_fe_mul(&x1, &x1n, &x3d); /* mag 1 */
    secp256k1_fe_mul(&x1, &x1, &jinv); /* mag 1 */
    secp256k1_fe_mul(&x2, &x2n, &x3d); /* mag 1 */
    secp256k1_fe_mul(&x2, &x2, &jinv); /* mag 1 */
    secp256k1_fe_mul(&x3, &x3n, &wd); /* mag 1 */
    secp256k1_fe_mul(&x3, &x3, &jinv); /* mag 1 */

    secp256k1_fe_sqr(&alphain, &x1); /* mag 1 */
    secp256k1_fe_mul(&alphain, &alphain, &x1); /* mag 1 */
    secp256k1_fe_add(&alphain, &b); /* mag 2 */
    secp256k1_fe_sqr(&betain, &x2); /* mag 1 */
    secp256k1_fe_mul(&betain, &betain, &x2); /* mag 1 */
    secp256k1_fe_add(&betain, &b); /* mag 2 */
    secp256k1_fe_sqr(&gammain, &x3); /* mag 1 */
    secp256k1_fe_mul(&gammain, &gammain, &x3); /* mag 1 */
    secp256k1_fe_add(&gammain, &b); /* mag 2 */

    alphaquad = secp256k1_fe_sqrt(&y1, &alphain);
    betaquad = secp256k1_fe_sqrt(&y2, &betain);
    secp256k1_fe_sqrt(&y3, &gammain);

    secp256k1_fe_cmov(&x1, &x2, (!alphaquad) & betaquad);
    secp256k1_fe_cmov(&y1, &y2, (!alphaquad) & betaquad);
    secp256k1_fe_cmov(&x1, &x3, (!alphaquad) & !betaquad);
    secp256k1_fe_cmov(&y1, &y3, (!alphaquad) & !betaquad);

    secp256k1_ge_set_xy(ge, &x1, &y1);

    /* The linked algorithm from the paper uses the Jacobi symbol of t to
     * determine the Jacobi symbol of the produced y coordinate. Since the
     * rest of the algorithm only uses t^2, we can safely use another criterion
     * as long as negation of t results in negation of the y coordinate. Here
     * we choose to use t's oddness, as it is faster to determine. */
    secp256k1_fe_negate(&tmp, &ge->y, 1);
    secp256k1_fe_cmov(&ge->y, &tmp, secp256k1_fe_is_odd(t));
}